

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  void *pvVar16;
  __int_type_conflict _Var17;
  long lVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar69;
  uint uVar70;
  long lVar71;
  uint uVar72;
  uint uVar74;
  ulong uVar75;
  ulong uVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar79 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar110 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float t1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar192;
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar188 [32];
  float fVar194;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar216;
  float fVar217;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar218;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar222;
  float fVar234;
  float fVar235;
  undefined1 auVar223 [16];
  float fVar236;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar237;
  float fVar239;
  float fVar240;
  undefined1 auVar232 [32];
  undefined1 auVar238 [16];
  vfloat4 b0;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  float fVar263;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar277;
  float fVar278;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar279;
  undefined1 auVar276 [32];
  float pp;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar300;
  float fVar301;
  vfloat4 a0_1;
  float fVar302;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar303;
  float fVar310;
  undefined1 auVar304 [16];
  float fVar311;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar308;
  float fVar309;
  float fVar312;
  float fVar313;
  float fVar314;
  float in_register_0000151c;
  undefined1 auVar307 [32];
  float fVar315;
  float fVar316;
  float fVar322;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar320;
  float fVar321;
  undefined1 auVar319 [32];
  float fVar323;
  float fVar324;
  float fVar336;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar334;
  float fVar335;
  float in_register_0000159c;
  undefined1 auVar331 [32];
  undefined1 auVar333 [64];
  float fVar341;
  vfloat4 a0;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float in_register_000015dc;
  undefined1 auVar340 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  RTCFilterFunctionNArguments local_550;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  undefined1 auStack_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  uint auStack_4a0 [4];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  float afStack_360 [8];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 auStack_170 [16];
  undefined1 local_160 [16];
  undefined1 auStack_150 [16];
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar73;
  undefined1 auVar233 [32];
  undefined1 auVar332 [32];
  
  PVar12 = prim[1];
  uVar76 = (ulong)(byte)PVar12;
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar292 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar292 = vinsertps_avx(auVar292,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar83 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + uVar76 * 0x19 + 6));
  fVar198 = *(float *)(prim + uVar76 * 0x19 + 0x12);
  auVar106._0_4_ = fVar198 * auVar83._0_4_;
  auVar106._4_4_ = fVar198 * auVar83._4_4_;
  auVar106._8_4_ = fVar198 * auVar83._8_4_;
  auVar106._12_4_ = fVar198 * auVar83._12_4_;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 6)));
  auVar223._0_4_ = fVar198 * auVar292._0_4_;
  auVar223._4_4_ = fVar198 * auVar292._4_4_;
  auVar223._8_4_ = fVar198 * auVar292._8_4_;
  auVar223._12_4_ = fVar198 * auVar292._12_4_;
  auVar292 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 10)));
  auVar94._16_16_ = auVar292;
  auVar94._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 6)));
  auVar292 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 10)));
  auVar156._16_16_ = auVar292;
  auVar156._0_16_ = auVar83;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 6)));
  auVar292 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 10)));
  auVar19 = vcvtdq2ps_avx(auVar156);
  auVar168._16_16_ = auVar292;
  auVar168._0_16_ = auVar83;
  auVar20 = vcvtdq2ps_avx(auVar168);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xb + 6)));
  auVar292 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xb + 10)));
  auVar169._16_16_ = auVar292;
  auVar169._0_16_ = auVar83;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xc + 6)));
  auVar21 = vcvtdq2ps_avx(auVar169);
  auVar292 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xc + 10)));
  auVar211._16_16_ = auVar292;
  auVar211._0_16_ = auVar83;
  auVar22 = vcvtdq2ps_avx(auVar211);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xd + 6)));
  auVar292 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xd + 10)));
  auVar249._16_16_ = auVar292;
  auVar249._0_16_ = auVar83;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x12 + 6)));
  auVar292 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x12 + 10)));
  auVar23 = vcvtdq2ps_avx(auVar249);
  auVar250._16_16_ = auVar292;
  auVar250._0_16_ = auVar83;
  auVar24 = vcvtdq2ps_avx(auVar250);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x13 + 6)));
  auVar292 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x13 + 10)));
  auVar273._16_16_ = auVar292;
  auVar273._0_16_ = auVar83;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x14 + 6)));
  auVar25 = vcvtdq2ps_avx(auVar273);
  auVar292 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0x14 + 10)));
  auVar287._16_16_ = auVar292;
  auVar287._0_16_ = auVar83;
  auVar26 = vcvtdq2ps_avx(auVar287);
  auVar83 = vshufps_avx(auVar223,auVar223,0);
  auVar292 = vshufps_avx(auVar223,auVar223,0x55);
  auVar155 = vshufps_avx(auVar223,auVar223,0xaa);
  fVar198 = auVar155._0_4_;
  fVar216 = auVar155._4_4_;
  fVar217 = auVar155._8_4_;
  fVar218 = auVar155._12_4_;
  fVar219 = auVar292._0_4_;
  fVar220 = auVar292._4_4_;
  fVar221 = auVar292._8_4_;
  fVar173 = auVar292._12_4_;
  fVar192 = auVar83._0_4_;
  fVar193 = auVar83._4_4_;
  fVar194 = auVar83._8_4_;
  fVar195 = auVar83._12_4_;
  auVar307._0_4_ = fVar192 * auVar94._0_4_ + fVar219 * auVar19._0_4_ + fVar198 * auVar20._0_4_;
  auVar307._4_4_ = fVar193 * auVar94._4_4_ + fVar220 * auVar19._4_4_ + fVar216 * auVar20._4_4_;
  auVar307._8_4_ = fVar194 * auVar94._8_4_ + fVar221 * auVar19._8_4_ + fVar217 * auVar20._8_4_;
  auVar307._12_4_ = fVar195 * auVar94._12_4_ + fVar173 * auVar19._12_4_ + fVar218 * auVar20._12_4_;
  auVar307._16_4_ = fVar192 * auVar94._16_4_ + fVar219 * auVar19._16_4_ + fVar198 * auVar20._16_4_;
  auVar307._20_4_ = fVar193 * auVar94._20_4_ + fVar220 * auVar19._20_4_ + fVar216 * auVar20._20_4_;
  auVar307._24_4_ = fVar194 * auVar94._24_4_ + fVar221 * auVar19._24_4_ + fVar217 * auVar20._24_4_;
  auVar307._28_4_ = fVar173 + in_register_000015dc + in_register_0000151c;
  auVar297._0_4_ = fVar192 * auVar21._0_4_ + fVar219 * auVar22._0_4_ + auVar23._0_4_ * fVar198;
  auVar297._4_4_ = fVar193 * auVar21._4_4_ + fVar220 * auVar22._4_4_ + auVar23._4_4_ * fVar216;
  auVar297._8_4_ = fVar194 * auVar21._8_4_ + fVar221 * auVar22._8_4_ + auVar23._8_4_ * fVar217;
  auVar297._12_4_ = fVar195 * auVar21._12_4_ + fVar173 * auVar22._12_4_ + auVar23._12_4_ * fVar218;
  auVar297._16_4_ = fVar192 * auVar21._16_4_ + fVar219 * auVar22._16_4_ + auVar23._16_4_ * fVar198;
  auVar297._20_4_ = fVar193 * auVar21._20_4_ + fVar220 * auVar22._20_4_ + auVar23._20_4_ * fVar216;
  auVar297._24_4_ = fVar194 * auVar21._24_4_ + fVar221 * auVar22._24_4_ + auVar23._24_4_ * fVar217;
  auVar297._28_4_ = fVar173 + in_register_000015dc + in_register_0000159c;
  auVar232._0_4_ = fVar192 * auVar24._0_4_ + fVar219 * auVar25._0_4_ + auVar26._0_4_ * fVar198;
  auVar232._4_4_ = fVar193 * auVar24._4_4_ + fVar220 * auVar25._4_4_ + auVar26._4_4_ * fVar216;
  auVar232._8_4_ = fVar194 * auVar24._8_4_ + fVar221 * auVar25._8_4_ + auVar26._8_4_ * fVar217;
  auVar232._12_4_ = fVar195 * auVar24._12_4_ + fVar173 * auVar25._12_4_ + auVar26._12_4_ * fVar218;
  auVar232._16_4_ = fVar192 * auVar24._16_4_ + fVar219 * auVar25._16_4_ + auVar26._16_4_ * fVar198;
  auVar232._20_4_ = fVar193 * auVar24._20_4_ + fVar220 * auVar25._20_4_ + auVar26._20_4_ * fVar216;
  auVar232._24_4_ = fVar194 * auVar24._24_4_ + fVar221 * auVar25._24_4_ + auVar26._24_4_ * fVar217;
  auVar232._28_4_ = fVar195 + fVar173 + fVar218;
  auVar83 = vshufps_avx(auVar106,auVar106,0);
  auVar292 = vshufps_avx(auVar106,auVar106,0x55);
  auVar155 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar216 = auVar155._0_4_;
  fVar217 = auVar155._4_4_;
  fVar218 = auVar155._8_4_;
  fVar219 = auVar155._12_4_;
  fVar193 = auVar292._0_4_;
  fVar194 = auVar292._4_4_;
  fVar195 = auVar292._8_4_;
  fVar196 = auVar292._12_4_;
  fVar220 = auVar83._0_4_;
  fVar221 = auVar83._4_4_;
  fVar173 = auVar83._8_4_;
  fVar192 = auVar83._12_4_;
  fVar198 = auVar94._28_4_;
  auVar127._0_4_ = fVar220 * auVar94._0_4_ + fVar193 * auVar19._0_4_ + fVar216 * auVar20._0_4_;
  auVar127._4_4_ = fVar221 * auVar94._4_4_ + fVar194 * auVar19._4_4_ + fVar217 * auVar20._4_4_;
  auVar127._8_4_ = fVar173 * auVar94._8_4_ + fVar195 * auVar19._8_4_ + fVar218 * auVar20._8_4_;
  auVar127._12_4_ = fVar192 * auVar94._12_4_ + fVar196 * auVar19._12_4_ + fVar219 * auVar20._12_4_;
  auVar127._16_4_ = fVar220 * auVar94._16_4_ + fVar193 * auVar19._16_4_ + fVar216 * auVar20._16_4_;
  auVar127._20_4_ = fVar221 * auVar94._20_4_ + fVar194 * auVar19._20_4_ + fVar217 * auVar20._20_4_;
  auVar127._24_4_ = fVar173 * auVar94._24_4_ + fVar195 * auVar19._24_4_ + fVar218 * auVar20._24_4_;
  auVar127._28_4_ = fVar198 + auVar19._28_4_ + auVar20._28_4_;
  auVar170._0_4_ = fVar220 * auVar21._0_4_ + auVar23._0_4_ * fVar216 + fVar193 * auVar22._0_4_;
  auVar170._4_4_ = fVar221 * auVar21._4_4_ + auVar23._4_4_ * fVar217 + fVar194 * auVar22._4_4_;
  auVar170._8_4_ = fVar173 * auVar21._8_4_ + auVar23._8_4_ * fVar218 + fVar195 * auVar22._8_4_;
  auVar170._12_4_ = fVar192 * auVar21._12_4_ + auVar23._12_4_ * fVar219 + fVar196 * auVar22._12_4_;
  auVar170._16_4_ = fVar220 * auVar21._16_4_ + auVar23._16_4_ * fVar216 + fVar193 * auVar22._16_4_;
  auVar170._20_4_ = fVar221 * auVar21._20_4_ + auVar23._20_4_ * fVar217 + fVar194 * auVar22._20_4_;
  auVar170._24_4_ = fVar173 * auVar21._24_4_ + auVar23._24_4_ * fVar218 + fVar195 * auVar22._24_4_;
  auVar170._28_4_ = fVar198 + auVar23._28_4_ + auVar20._28_4_;
  auVar188._8_4_ = 0x7fffffff;
  auVar188._0_8_ = 0x7fffffff7fffffff;
  auVar188._12_4_ = 0x7fffffff;
  auVar188._16_4_ = 0x7fffffff;
  auVar188._20_4_ = 0x7fffffff;
  auVar188._24_4_ = 0x7fffffff;
  auVar188._28_4_ = 0x7fffffff;
  auVar157._0_4_ = fVar220 * auVar24._0_4_ + fVar193 * auVar25._0_4_ + auVar26._0_4_ * fVar216;
  auVar157._4_4_ = fVar221 * auVar24._4_4_ + fVar194 * auVar25._4_4_ + auVar26._4_4_ * fVar217;
  auVar157._8_4_ = fVar173 * auVar24._8_4_ + fVar195 * auVar25._8_4_ + auVar26._8_4_ * fVar218;
  auVar157._12_4_ = fVar192 * auVar24._12_4_ + fVar196 * auVar25._12_4_ + auVar26._12_4_ * fVar219;
  auVar157._16_4_ = fVar220 * auVar24._16_4_ + fVar193 * auVar25._16_4_ + auVar26._16_4_ * fVar216;
  auVar157._20_4_ = fVar221 * auVar24._20_4_ + fVar194 * auVar25._20_4_ + auVar26._20_4_ * fVar217;
  auVar157._24_4_ = fVar173 * auVar24._24_4_ + fVar195 * auVar25._24_4_ + auVar26._24_4_ * fVar218;
  auVar157._28_4_ = fVar198 + auVar22._28_4_ + fVar219;
  auVar94 = vandps_avx(auVar307,auVar188);
  auVar212._8_4_ = 0x219392ef;
  auVar212._0_8_ = 0x219392ef219392ef;
  auVar212._12_4_ = 0x219392ef;
  auVar212._16_4_ = 0x219392ef;
  auVar212._20_4_ = 0x219392ef;
  auVar212._24_4_ = 0x219392ef;
  auVar212._28_4_ = 0x219392ef;
  auVar94 = vcmpps_avx(auVar94,auVar212,1);
  auVar19 = vblendvps_avx(auVar307,auVar212,auVar94);
  auVar94 = vandps_avx(auVar297,auVar188);
  auVar94 = vcmpps_avx(auVar94,auVar212,1);
  auVar20 = vblendvps_avx(auVar297,auVar212,auVar94);
  auVar94 = vandps_avx(auVar232,auVar188);
  auVar94 = vcmpps_avx(auVar94,auVar212,1);
  auVar21 = vrcpps_avx(auVar19);
  auVar94 = vblendvps_avx(auVar232,auVar212,auVar94);
  auVar274._8_4_ = 0x3f800000;
  auVar274._0_8_ = 0x3f8000003f800000;
  auVar274._12_4_ = 0x3f800000;
  auVar274._16_4_ = 0x3f800000;
  auVar274._20_4_ = 0x3f800000;
  auVar274._24_4_ = 0x3f800000;
  auVar274._28_4_ = 0x3f800000;
  fVar173 = auVar21._0_4_;
  fVar192 = auVar21._4_4_;
  auVar22._4_4_ = fVar192 * auVar19._4_4_;
  auVar22._0_4_ = fVar173 * auVar19._0_4_;
  fVar193 = auVar21._8_4_;
  auVar22._8_4_ = fVar193 * auVar19._8_4_;
  fVar194 = auVar21._12_4_;
  auVar22._12_4_ = fVar194 * auVar19._12_4_;
  fVar195 = auVar21._16_4_;
  auVar22._16_4_ = fVar195 * auVar19._16_4_;
  fVar196 = auVar21._20_4_;
  auVar22._20_4_ = fVar196 * auVar19._20_4_;
  fVar197 = auVar21._24_4_;
  auVar22._24_4_ = fVar197 * auVar19._24_4_;
  auVar22._28_4_ = auVar19._28_4_;
  auVar19 = vsubps_avx(auVar274,auVar22);
  fVar173 = fVar173 + fVar173 * auVar19._0_4_;
  fVar192 = fVar192 + fVar192 * auVar19._4_4_;
  fVar193 = fVar193 + fVar193 * auVar19._8_4_;
  fVar194 = fVar194 + fVar194 * auVar19._12_4_;
  fVar195 = fVar195 + fVar195 * auVar19._16_4_;
  fVar196 = fVar196 + fVar196 * auVar19._20_4_;
  fVar197 = fVar197 + fVar197 * auVar19._24_4_;
  auVar19 = vrcpps_avx(auVar20);
  fVar198 = auVar19._0_4_;
  fVar216 = auVar19._4_4_;
  auVar21._4_4_ = fVar216 * auVar20._4_4_;
  auVar21._0_4_ = fVar198 * auVar20._0_4_;
  fVar217 = auVar19._8_4_;
  auVar21._8_4_ = fVar217 * auVar20._8_4_;
  fVar218 = auVar19._12_4_;
  auVar21._12_4_ = fVar218 * auVar20._12_4_;
  fVar219 = auVar19._16_4_;
  auVar21._16_4_ = fVar219 * auVar20._16_4_;
  fVar220 = auVar19._20_4_;
  auVar21._20_4_ = fVar220 * auVar20._20_4_;
  fVar221 = auVar19._24_4_;
  auVar21._24_4_ = fVar221 * auVar20._24_4_;
  auVar21._28_4_ = 0x219392ef;
  auVar21 = vsubps_avx(auVar274,auVar21);
  auVar20 = vrcpps_avx(auVar94);
  fVar198 = fVar198 + fVar198 * auVar21._0_4_;
  fVar216 = fVar216 + fVar216 * auVar21._4_4_;
  fVar217 = fVar217 + fVar217 * auVar21._8_4_;
  fVar218 = fVar218 + fVar218 * auVar21._12_4_;
  fVar219 = fVar219 + fVar219 * auVar21._16_4_;
  fVar220 = fVar220 + fVar220 * auVar21._20_4_;
  fVar221 = fVar221 + fVar221 * auVar21._24_4_;
  fVar222 = auVar20._0_4_;
  fVar234 = auVar20._4_4_;
  auVar23._4_4_ = fVar234 * auVar94._4_4_;
  auVar23._0_4_ = fVar222 * auVar94._0_4_;
  fVar235 = auVar20._8_4_;
  auVar23._8_4_ = fVar235 * auVar94._8_4_;
  fVar236 = auVar20._12_4_;
  auVar23._12_4_ = fVar236 * auVar94._12_4_;
  fVar237 = auVar20._16_4_;
  auVar23._16_4_ = fVar237 * auVar94._16_4_;
  fVar239 = auVar20._20_4_;
  auVar23._20_4_ = fVar239 * auVar94._20_4_;
  fVar240 = auVar20._24_4_;
  auVar23._24_4_ = fVar240 * auVar94._24_4_;
  auVar23._28_4_ = auVar19._28_4_;
  auVar94 = vsubps_avx(auVar274,auVar23);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar76 * 7 + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  fVar222 = fVar222 + fVar222 * auVar94._0_4_;
  fVar234 = fVar234 + fVar234 * auVar94._4_4_;
  fVar235 = fVar235 + fVar235 * auVar94._8_4_;
  fVar236 = fVar236 + fVar236 * auVar94._12_4_;
  fVar237 = fVar237 + fVar237 * auVar94._16_4_;
  fVar239 = fVar239 + fVar239 * auVar94._20_4_;
  fVar240 = fVar240 + fVar240 * auVar94._24_4_;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = *(ulong *)(prim + uVar76 * 7 + 0xe);
  auVar292 = vpmovsxwd_avx(auVar292);
  auVar95._16_16_ = auVar292;
  auVar95._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar95);
  auVar94 = vsubps_avx(auVar94,auVar127);
  auVar77._0_4_ = fVar173 * auVar94._0_4_;
  auVar77._4_4_ = fVar192 * auVar94._4_4_;
  auVar77._8_4_ = fVar193 * auVar94._8_4_;
  auVar77._12_4_ = fVar194 * auVar94._12_4_;
  auVar20._16_4_ = fVar195 * auVar94._16_4_;
  auVar20._0_16_ = auVar77;
  auVar20._20_4_ = fVar196 * auVar94._20_4_;
  auVar20._24_4_ = fVar197 * auVar94._24_4_;
  auVar20._28_4_ = auVar94._28_4_;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar76 * 9 + 6);
  auVar83 = vpmovsxwd_avx(auVar155);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar76 * 9 + 0xe);
  auVar292 = vpmovsxwd_avx(auVar9);
  auVar251._16_16_ = auVar292;
  auVar251._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar251);
  auVar94 = vsubps_avx(auVar94,auVar127);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar76 * 0xe + 6);
  auVar83 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar76 * 0xe + 0xe);
  auVar292 = vpmovsxwd_avx(auVar11);
  auVar107._0_4_ = fVar173 * auVar94._0_4_;
  auVar107._4_4_ = fVar192 * auVar94._4_4_;
  auVar107._8_4_ = fVar193 * auVar94._8_4_;
  auVar107._12_4_ = fVar194 * auVar94._12_4_;
  auVar24._16_4_ = fVar195 * auVar94._16_4_;
  auVar24._0_16_ = auVar107;
  auVar24._20_4_ = fVar196 * auVar94._20_4_;
  auVar24._24_4_ = fVar197 * auVar94._24_4_;
  auVar24._28_4_ = auVar94._28_4_;
  auVar189._16_16_ = auVar292;
  auVar189._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar189);
  auVar94 = vsubps_avx(auVar94,auVar170);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar83 = vpmovsxwd_avx(auVar124);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 0xe);
  auVar292 = vpmovsxwd_avx(auVar112);
  auVar174._0_4_ = fVar198 * auVar94._0_4_;
  auVar174._4_4_ = fVar216 * auVar94._4_4_;
  auVar174._8_4_ = fVar217 * auVar94._8_4_;
  auVar174._12_4_ = fVar218 * auVar94._12_4_;
  auVar25._16_4_ = fVar219 * auVar94._16_4_;
  auVar25._0_16_ = auVar174;
  auVar25._20_4_ = fVar220 * auVar94._20_4_;
  auVar25._24_4_ = fVar221 * auVar94._24_4_;
  auVar25._28_4_ = auVar94._28_4_;
  auVar252._16_16_ = auVar292;
  auVar252._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar252);
  auVar94 = vsubps_avx(auVar94,auVar170);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar76 * 0x15 + 6);
  auVar83 = vpmovsxwd_avx(auVar141);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar76 * 0x15 + 0xe);
  auVar292 = vpmovsxwd_avx(auVar113);
  auVar161._0_4_ = fVar198 * auVar94._0_4_;
  auVar161._4_4_ = fVar216 * auVar94._4_4_;
  auVar161._8_4_ = fVar217 * auVar94._8_4_;
  auVar161._12_4_ = fVar218 * auVar94._12_4_;
  auVar26._16_4_ = fVar219 * auVar94._16_4_;
  auVar26._0_16_ = auVar161;
  auVar26._20_4_ = fVar220 * auVar94._20_4_;
  auVar26._24_4_ = fVar221 * auVar94._24_4_;
  auVar26._28_4_ = auVar94._28_4_;
  auVar213._16_16_ = auVar292;
  auVar213._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar213);
  auVar94 = vsubps_avx(auVar94,auVar157);
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *(ulong *)(prim + uVar76 * 0x17 + 6);
  auVar83 = vpmovsxwd_avx(auVar238);
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *(ulong *)(prim + uVar76 * 0x17 + 0xe);
  auVar292 = vpmovsxwd_avx(auVar268);
  auVar199._0_4_ = fVar222 * auVar94._0_4_;
  auVar199._4_4_ = fVar234 * auVar94._4_4_;
  auVar199._8_4_ = fVar235 * auVar94._8_4_;
  auVar199._12_4_ = fVar236 * auVar94._12_4_;
  auVar27._16_4_ = fVar237 * auVar94._16_4_;
  auVar27._0_16_ = auVar199;
  auVar27._20_4_ = fVar239 * auVar94._20_4_;
  auVar27._24_4_ = fVar240 * auVar94._24_4_;
  auVar27._28_4_ = auVar94._28_4_;
  auVar253._16_16_ = auVar292;
  auVar253._0_16_ = auVar83;
  auVar94 = vcvtdq2ps_avx(auVar253);
  auVar94 = vsubps_avx(auVar94,auVar157);
  auVar135._0_4_ = fVar222 * auVar94._0_4_;
  auVar135._4_4_ = fVar234 * auVar94._4_4_;
  auVar135._8_4_ = fVar235 * auVar94._8_4_;
  auVar135._12_4_ = fVar236 * auVar94._12_4_;
  auVar28._16_4_ = fVar237 * auVar94._16_4_;
  auVar28._0_16_ = auVar135;
  auVar28._20_4_ = fVar239 * auVar94._20_4_;
  auVar28._24_4_ = fVar240 * auVar94._24_4_;
  auVar28._28_4_ = auVar94._28_4_;
  auVar83 = vpminsd_avx(auVar20._16_16_,auVar24._16_16_);
  auVar292 = vpminsd_avx(auVar77,auVar107);
  auVar288._16_16_ = auVar83;
  auVar288._0_16_ = auVar292;
  auVar83 = vpminsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar292 = vpminsd_avx(auVar174,auVar161);
  auVar298._16_16_ = auVar83;
  auVar298._0_16_ = auVar292;
  auVar94 = vmaxps_avx(auVar288,auVar298);
  auVar83 = vpminsd_avx(auVar27._16_16_,auVar28._16_16_);
  auVar292 = vpminsd_avx(auVar199,auVar135);
  auVar319._16_16_ = auVar83;
  auVar319._0_16_ = auVar292;
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar331._4_4_ = uVar6;
  auVar331._0_4_ = uVar6;
  auVar331._8_4_ = uVar6;
  auVar331._12_4_ = uVar6;
  auVar331._16_4_ = uVar6;
  auVar331._20_4_ = uVar6;
  auVar331._24_4_ = uVar6;
  auVar331._28_4_ = uVar6;
  auVar19 = vmaxps_avx(auVar319,auVar331);
  auVar94 = vmaxps_avx(auVar94,auVar19);
  local_300._4_4_ = auVar94._4_4_ * 0.99999964;
  local_300._0_4_ = auVar94._0_4_ * 0.99999964;
  local_300._8_4_ = auVar94._8_4_ * 0.99999964;
  local_300._12_4_ = auVar94._12_4_ * 0.99999964;
  local_300._16_4_ = auVar94._16_4_ * 0.99999964;
  local_300._20_4_ = auVar94._20_4_ * 0.99999964;
  local_300._24_4_ = auVar94._24_4_ * 0.99999964;
  local_300._28_4_ = auVar94._28_4_;
  auVar83 = vpmaxsd_avx(auVar20._16_16_,auVar24._16_16_);
  auVar292 = vpmaxsd_avx(auVar77,auVar107);
  auVar96._16_16_ = auVar83;
  auVar96._0_16_ = auVar292;
  auVar83 = vpmaxsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar292 = vpmaxsd_avx(auVar174,auVar161);
  auVar128._16_16_ = auVar83;
  auVar128._0_16_ = auVar292;
  auVar94 = vminps_avx(auVar96,auVar128);
  auVar83 = vpmaxsd_avx(auVar27._16_16_,auVar28._16_16_);
  auVar292 = vpmaxsd_avx(auVar199,auVar135);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar171._4_4_ = uVar6;
  auVar171._0_4_ = uVar6;
  auVar171._8_4_ = uVar6;
  auVar171._12_4_ = uVar6;
  auVar171._16_4_ = uVar6;
  auVar171._20_4_ = uVar6;
  auVar171._24_4_ = uVar6;
  auVar171._28_4_ = uVar6;
  auVar129._16_16_ = auVar83;
  auVar129._0_16_ = auVar292;
  auVar19 = vminps_avx(auVar129,auVar171);
  auVar94 = vminps_avx(auVar94,auVar19);
  auVar19._4_4_ = auVar94._4_4_ * 1.0000004;
  auVar19._0_4_ = auVar94._0_4_ * 1.0000004;
  auVar19._8_4_ = auVar94._8_4_ * 1.0000004;
  auVar19._12_4_ = auVar94._12_4_ * 1.0000004;
  auVar19._16_4_ = auVar94._16_4_ * 1.0000004;
  auVar19._20_4_ = auVar94._20_4_ * 1.0000004;
  auVar19._24_4_ = auVar94._24_4_ * 1.0000004;
  auVar19._28_4_ = auVar94._28_4_;
  auVar94 = vcmpps_avx(local_300,auVar19,2);
  auVar83 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar130._16_16_ = auVar83;
  auVar130._0_16_ = auVar83;
  auVar19 = vcvtdq2ps_avx(auVar130);
  auVar19 = vcmpps_avx(_DAT_01f7b060,auVar19,1);
  auVar94 = vandps_avx(auVar94,auVar19);
  uVar69 = vmovmskps_avx(auVar94);
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  uVar74 = 1 << ((byte)k & 0x1f);
LAB_0099bc49:
  uVar76 = (ulong)uVar69;
  if (uVar76 == 0) {
    return;
  }
  lVar71 = 0;
  if (uVar76 != 0) {
    for (; (uVar69 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  uVar69 = *(uint *)(prim + 2);
  uVar13 = *(uint *)(prim + lVar71 * 4 + 6);
  pGVar14 = (context->scene->geometries).items[uVar69].ptr;
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                           pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar13);
  p_Var15 = pGVar14[1].intersectionFilterN;
  pvVar16 = pGVar14[2].userPtr;
  _Var17 = pGVar14[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var17 + uVar75 * (long)pvVar16);
  fVar198 = *pfVar1;
  fVar216 = pfVar1[1];
  fVar217 = pfVar1[2];
  fVar218 = pfVar1[3];
  pfVar1 = (float *)(_Var17 + (uVar75 + 1) * (long)pvVar16);
  pfVar2 = (float *)(_Var17 + (uVar75 + 2) * (long)pvVar16);
  pfVar3 = (float *)(_Var17 + (long)pvVar16 * (uVar75 + 3));
  fVar219 = *pfVar3;
  fVar220 = pfVar3[1];
  fVar221 = pfVar3[2];
  fVar173 = pfVar3[3];
  uVar76 = uVar76 - 1 & uVar76;
  lVar71 = *(long *)&pGVar14[1].time_range.upper;
  pfVar3 = (float *)(lVar71 + (long)p_Var15 * uVar75);
  fVar192 = *pfVar3;
  fVar193 = pfVar3[1];
  fVar194 = pfVar3[2];
  fVar195 = pfVar3[3];
  pfVar3 = (float *)(lVar71 + (long)p_Var15 * (uVar75 + 1));
  pfVar4 = (float *)(lVar71 + (long)p_Var15 * (uVar75 + 2));
  lVar18 = 0;
  if (uVar76 != 0) {
    for (; (uVar76 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
    }
  }
  pfVar5 = (float *)(lVar71 + (long)p_Var15 * (uVar75 + 3));
  fVar196 = *pfVar5;
  fVar197 = pfVar5[1];
  fVar222 = pfVar5[2];
  fVar234 = pfVar5[3];
  if (((uVar76 != 0) && (uVar75 = uVar76 - 1 & uVar76, uVar75 != 0)) && (lVar71 = 0, uVar75 != 0)) {
    for (; (uVar75 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
    }
  }
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar155 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar235 = *pfVar4 * 0.0;
  fVar236 = pfVar4[1] * 0.0;
  fVar237 = pfVar4[2] * 0.0;
  fVar239 = pfVar4[3] * 0.0;
  fVar240 = fVar235 + fVar196 * 0.0;
  fVar300 = fVar236 + fVar197 * 0.0;
  fVar301 = fVar237 + fVar222 * 0.0;
  fVar302 = fVar239 + fVar234 * 0.0;
  fVar303 = *pfVar3 * 0.0;
  fVar308 = pfVar3[1] * 0.0;
  fVar309 = pfVar3[2] * 0.0;
  fVar310 = pfVar3[3] * 0.0;
  local_700._0_4_ = fVar192 + fVar303 + fVar240;
  local_700._4_4_ = fVar193 + fVar308 + fVar300;
  fStack_6f8 = fVar194 + fVar309 + fVar301;
  fStack_6f4 = fVar195 + fVar310 + fVar302;
  auVar136._0_4_ = fVar240 + *pfVar3 * 3.0;
  auVar136._4_4_ = fVar300 + pfVar3[1] * 3.0;
  auVar136._8_4_ = fVar301 + pfVar3[2] * 3.0;
  auVar136._12_4_ = fVar302 + pfVar3[3] * 3.0;
  auVar290._0_4_ = fVar192 * 3.0;
  auVar290._4_4_ = fVar193 * 3.0;
  auVar290._8_4_ = fVar194 * 3.0;
  auVar290._12_4_ = fVar195 * 3.0;
  auVar141 = vsubps_avx(auVar136,auVar290);
  fVar316 = *pfVar2 * 0.0;
  fVar320 = pfVar2[1] * 0.0;
  fVar321 = pfVar2[2] * 0.0;
  fVar322 = pfVar2[3] * 0.0;
  fVar240 = fVar316 + fVar219 * 0.0;
  fVar300 = fVar320 + fVar220 * 0.0;
  fVar301 = fVar321 + fVar221 * 0.0;
  fVar302 = fVar322 + fVar173 * 0.0;
  fVar324 = *pfVar1 * 0.0;
  fVar334 = pfVar1[1] * 0.0;
  fVar335 = pfVar1[2] * 0.0;
  fVar336 = pfVar1[3] * 0.0;
  auVar337._0_4_ = fVar324 + fVar240 + fVar198;
  auVar337._4_4_ = fVar334 + fVar300 + fVar216;
  auVar337._8_4_ = fVar335 + fVar301 + fVar217;
  auVar337._12_4_ = fVar336 + fVar302 + fVar218;
  auVar162._0_4_ = fVar240 + *pfVar1 * 3.0;
  auVar162._4_4_ = fVar300 + pfVar1[1] * 3.0;
  auVar162._8_4_ = fVar301 + pfVar1[2] * 3.0;
  auVar162._12_4_ = fVar302 + pfVar1[3] * 3.0;
  auVar291._0_4_ = fVar198 * 3.0;
  auVar291._4_4_ = fVar216 * 3.0;
  auVar291._8_4_ = fVar217 * 3.0;
  auVar291._12_4_ = fVar218 * 3.0;
  auVar10 = vsubps_avx(auVar162,auVar291);
  auVar255._0_4_ = fVar192 * 0.0;
  auVar255._4_4_ = fVar193 * 0.0;
  auVar255._8_4_ = fVar194 * 0.0;
  auVar255._12_4_ = fVar195 * 0.0;
  auVar163._0_4_ = auVar255._0_4_ + fVar303 + fVar235 + fVar196;
  auVar163._4_4_ = auVar255._4_4_ + fVar308 + fVar236 + fVar197;
  auVar163._8_4_ = auVar255._8_4_ + fVar309 + fVar237 + fVar222;
  auVar163._12_4_ = auVar255._12_4_ + fVar310 + fVar239 + fVar234;
  auVar264._0_4_ = fVar196 * 3.0;
  auVar264._4_4_ = fVar197 * 3.0;
  auVar264._8_4_ = fVar222 * 3.0;
  auVar264._12_4_ = fVar234 * 3.0;
  auVar175._0_4_ = *pfVar4 * 3.0;
  auVar175._4_4_ = pfVar4[1] * 3.0;
  auVar175._8_4_ = pfVar4[2] * 3.0;
  auVar175._12_4_ = pfVar4[3] * 3.0;
  auVar83 = vsubps_avx(auVar264,auVar175);
  auVar176._0_4_ = fVar303 + auVar83._0_4_;
  auVar176._4_4_ = fVar308 + auVar83._4_4_;
  auVar176._8_4_ = fVar309 + auVar83._8_4_;
  auVar176._12_4_ = fVar310 + auVar83._12_4_;
  auVar113 = vsubps_avx(auVar176,auVar255);
  auVar200._0_4_ = fVar198 * 0.0;
  auVar200._4_4_ = fVar216 * 0.0;
  auVar200._8_4_ = fVar217 * 0.0;
  auVar200._12_4_ = fVar218 * 0.0;
  auVar265._0_4_ = fVar324 + fVar316 + fVar219 + auVar200._0_4_;
  auVar265._4_4_ = fVar334 + fVar320 + fVar220 + auVar200._4_4_;
  auVar265._8_4_ = fVar335 + fVar321 + fVar221 + auVar200._8_4_;
  auVar265._12_4_ = fVar336 + fVar322 + fVar173 + auVar200._12_4_;
  auVar241._0_4_ = fVar219 * 3.0;
  auVar241._4_4_ = fVar220 * 3.0;
  auVar241._8_4_ = fVar221 * 3.0;
  auVar241._12_4_ = fVar173 * 3.0;
  auVar224._0_4_ = *pfVar2 * 3.0;
  auVar224._4_4_ = pfVar2[1] * 3.0;
  auVar224._8_4_ = pfVar2[2] * 3.0;
  auVar224._12_4_ = pfVar2[3] * 3.0;
  auVar83 = vsubps_avx(auVar241,auVar224);
  auVar225._0_4_ = fVar324 + auVar83._0_4_;
  auVar225._4_4_ = fVar334 + auVar83._4_4_;
  auVar225._8_4_ = fVar335 + auVar83._8_4_;
  auVar225._12_4_ = fVar336 + auVar83._12_4_;
  auVar124 = vsubps_avx(auVar225,auVar200);
  auVar83 = vshufps_avx(auVar141,auVar141,0xc9);
  auVar292 = vshufps_avx(auVar337,auVar337,0xc9);
  fVar240 = auVar141._0_4_;
  auVar242._0_4_ = fVar240 * auVar292._0_4_;
  fVar300 = auVar141._4_4_;
  auVar242._4_4_ = fVar300 * auVar292._4_4_;
  fVar301 = auVar141._8_4_;
  auVar242._8_4_ = fVar301 * auVar292._8_4_;
  fVar302 = auVar141._12_4_;
  auVar242._12_4_ = fVar302 * auVar292._12_4_;
  auVar256._0_4_ = auVar337._0_4_ * auVar83._0_4_;
  auVar256._4_4_ = auVar337._4_4_ * auVar83._4_4_;
  auVar256._8_4_ = auVar337._8_4_ * auVar83._8_4_;
  auVar256._12_4_ = auVar337._12_4_ * auVar83._12_4_;
  auVar292 = vsubps_avx(auVar256,auVar242);
  auVar9 = vshufps_avx(auVar292,auVar292,0xc9);
  auVar292 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar243._0_4_ = fVar240 * auVar292._0_4_;
  auVar243._4_4_ = fVar300 * auVar292._4_4_;
  auVar243._8_4_ = fVar301 * auVar292._8_4_;
  auVar243._12_4_ = fVar302 * auVar292._12_4_;
  auVar201._0_4_ = auVar10._0_4_ * auVar83._0_4_;
  auVar201._4_4_ = auVar10._4_4_ * auVar83._4_4_;
  auVar201._8_4_ = auVar10._8_4_ * auVar83._8_4_;
  auVar201._12_4_ = auVar10._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar201,auVar243);
  auVar10 = vshufps_avx(auVar83,auVar83,0xc9);
  auVar83 = vshufps_avx(auVar113,auVar113,0xc9);
  auVar292 = vshufps_avx(auVar265,auVar265,0xc9);
  fVar303 = auVar113._0_4_;
  auVar202._0_4_ = fVar303 * auVar292._0_4_;
  fVar308 = auVar113._4_4_;
  auVar202._4_4_ = fVar308 * auVar292._4_4_;
  fVar309 = auVar113._8_4_;
  auVar202._8_4_ = fVar309 * auVar292._8_4_;
  fVar310 = auVar113._12_4_;
  auVar202._12_4_ = fVar310 * auVar292._12_4_;
  auVar266._0_4_ = auVar265._0_4_ * auVar83._0_4_;
  auVar266._4_4_ = auVar265._4_4_ * auVar83._4_4_;
  auVar266._8_4_ = auVar265._8_4_ * auVar83._8_4_;
  auVar266._12_4_ = auVar265._12_4_ * auVar83._12_4_;
  auVar292 = vsubps_avx(auVar266,auVar202);
  auVar11 = vshufps_avx(auVar292,auVar292,0xc9);
  auVar292 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar267._0_4_ = auVar292._0_4_ * fVar303;
  auVar267._4_4_ = auVar292._4_4_ * fVar308;
  auVar267._8_4_ = auVar292._8_4_ * fVar309;
  auVar267._12_4_ = auVar292._12_4_ * fVar310;
  auVar226._0_4_ = auVar83._0_4_ * auVar124._0_4_;
  auVar226._4_4_ = auVar83._4_4_ * auVar124._4_4_;
  auVar226._8_4_ = auVar83._8_4_ * auVar124._8_4_;
  auVar226._12_4_ = auVar83._12_4_ * auVar124._12_4_;
  auVar83 = vsubps_avx(auVar226,auVar267);
  auVar124 = vshufps_avx(auVar83,auVar83,0xc9);
  auVar83 = vdpps_avx(auVar9,auVar9,0x7f);
  fVar219 = auVar83._0_4_;
  auVar268 = ZEXT416((uint)fVar219);
  auVar292 = vrsqrtss_avx(auVar268,auVar268);
  fVar198 = auVar292._0_4_;
  auVar292 = vdpps_avx(auVar9,auVar10,0x7f);
  auVar112 = ZEXT416((uint)(fVar198 * 1.5 - fVar219 * 0.5 * fVar198 * fVar198 * fVar198));
  auVar112 = vshufps_avx(auVar112,auVar112,0);
  fVar198 = auVar9._0_4_ * auVar112._0_4_;
  fVar216 = auVar9._4_4_ * auVar112._4_4_;
  fVar217 = auVar9._8_4_ * auVar112._8_4_;
  fVar218 = auVar9._12_4_ * auVar112._12_4_;
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar283._0_4_ = auVar10._0_4_ * auVar83._0_4_;
  auVar283._4_4_ = auVar10._4_4_ * auVar83._4_4_;
  auVar283._8_4_ = auVar10._8_4_ * auVar83._8_4_;
  auVar283._12_4_ = auVar10._12_4_ * auVar83._12_4_;
  auVar83 = vshufps_avx(auVar292,auVar292,0);
  auVar257._0_4_ = auVar9._0_4_ * auVar83._0_4_;
  auVar257._4_4_ = auVar9._4_4_ * auVar83._4_4_;
  auVar257._8_4_ = auVar9._8_4_ * auVar83._8_4_;
  auVar257._12_4_ = auVar9._12_4_ * auVar83._12_4_;
  auVar238 = vsubps_avx(auVar283,auVar257);
  auVar83 = vrcpss_avx(auVar268,auVar268);
  auVar83 = ZEXT416((uint)(auVar83._0_4_ * (2.0 - fVar219 * auVar83._0_4_)));
  auVar9 = vshufps_avx(auVar83,auVar83,0);
  auVar83 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar219 = auVar83._0_4_;
  auVar268 = ZEXT416((uint)fVar219);
  auVar292 = vrsqrtss_avx(auVar268,auVar268);
  fVar220 = auVar292._0_4_;
  auVar292 = ZEXT416((uint)(fVar220 * 1.5 - fVar219 * 0.5 * fVar220 * fVar220 * fVar220));
  auVar10 = vshufps_avx(auVar292,auVar292,0);
  fVar220 = auVar10._0_4_ * auVar11._0_4_;
  fVar221 = auVar10._4_4_ * auVar11._4_4_;
  fVar173 = auVar10._8_4_ * auVar11._8_4_;
  fVar192 = auVar10._12_4_ * auVar11._12_4_;
  auVar292 = vdpps_avx(auVar11,auVar124,0x7f);
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar244._0_4_ = auVar83._0_4_ * auVar124._0_4_;
  auVar244._4_4_ = auVar83._4_4_ * auVar124._4_4_;
  auVar244._8_4_ = auVar83._8_4_ * auVar124._8_4_;
  auVar244._12_4_ = auVar83._12_4_ * auVar124._12_4_;
  auVar83 = vshufps_avx(auVar292,auVar292,0);
  auVar203._0_4_ = auVar83._0_4_ * auVar11._0_4_;
  auVar203._4_4_ = auVar83._4_4_ * auVar11._4_4_;
  auVar203._8_4_ = auVar83._8_4_ * auVar11._8_4_;
  auVar203._12_4_ = auVar83._12_4_ * auVar11._12_4_;
  auVar124 = vsubps_avx(auVar244,auVar203);
  auVar83 = vrcpss_avx(auVar268,auVar268);
  auVar83 = ZEXT416((uint)((2.0 - fVar219 * auVar83._0_4_) * auVar83._0_4_));
  auVar83 = vshufps_avx(auVar83,auVar83,0);
  auVar292 = vshufps_avx(_local_700,_local_700,0xff);
  auVar269._0_4_ = auVar292._0_4_ * fVar198;
  auVar269._4_4_ = auVar292._4_4_ * fVar216;
  auVar269._8_4_ = auVar292._8_4_ * fVar217;
  auVar269._12_4_ = auVar292._12_4_ * fVar218;
  _local_4b0 = vsubps_avx(_local_700,auVar269);
  auVar11 = vshufps_avx(auVar141,auVar141,0xff);
  auVar227._0_4_ =
       auVar11._0_4_ * fVar198 + auVar112._0_4_ * auVar238._0_4_ * auVar9._0_4_ * auVar292._0_4_;
  auVar227._4_4_ =
       auVar11._4_4_ * fVar216 + auVar112._4_4_ * auVar238._4_4_ * auVar9._4_4_ * auVar292._4_4_;
  auVar227._8_4_ =
       auVar11._8_4_ * fVar217 + auVar112._8_4_ * auVar238._8_4_ * auVar9._8_4_ * auVar292._8_4_;
  auVar227._12_4_ =
       auVar11._12_4_ * fVar218 +
       auVar112._12_4_ * auVar238._12_4_ * auVar9._12_4_ * auVar292._12_4_;
  auVar11 = vsubps_avx(auVar141,auVar227);
  local_4c0._0_4_ = auVar269._0_4_ + (float)local_700._0_4_;
  local_4c0._4_4_ = auVar269._4_4_ + (float)local_700._4_4_;
  fStack_4b8 = auVar269._8_4_ + fStack_6f8;
  fStack_4b4 = auVar269._12_4_ + fStack_6f4;
  auVar292 = vshufps_avx(auVar163,auVar163,0xff);
  auVar137._0_4_ = fVar220 * auVar292._0_4_;
  auVar137._4_4_ = fVar221 * auVar292._4_4_;
  auVar137._8_4_ = fVar173 * auVar292._8_4_;
  auVar137._12_4_ = fVar192 * auVar292._12_4_;
  _local_4d0 = vsubps_avx(auVar163,auVar137);
  auVar9 = vshufps_avx(auVar113,auVar113,0xff);
  auVar108._0_4_ =
       fVar220 * auVar9._0_4_ + auVar292._0_4_ * auVar10._0_4_ * auVar124._0_4_ * auVar83._0_4_;
  auVar108._4_4_ =
       fVar221 * auVar9._4_4_ + auVar292._4_4_ * auVar10._4_4_ * auVar124._4_4_ * auVar83._4_4_;
  auVar108._8_4_ =
       fVar173 * auVar9._8_4_ + auVar292._8_4_ * auVar10._8_4_ * auVar124._8_4_ * auVar83._8_4_;
  auVar108._12_4_ =
       fVar192 * auVar9._12_4_ + auVar292._12_4_ * auVar10._12_4_ * auVar124._12_4_ * auVar83._12_4_
  ;
  auVar10 = vsubps_avx(auVar113,auVar108);
  fVar196 = auVar163._0_4_ + auVar137._0_4_;
  fVar197 = auVar163._4_4_ + auVar137._4_4_;
  fVar222 = auVar163._8_4_ + auVar137._8_4_;
  fVar234 = auVar163._12_4_ + auVar137._12_4_;
  local_4e0._0_4_ = local_4b0._0_4_ + auVar11._0_4_ * 0.33333334;
  local_4e0._4_4_ = local_4b0._4_4_ + auVar11._4_4_ * 0.33333334;
  fStack_4d8 = local_4b0._8_4_ + auVar11._8_4_ * 0.33333334;
  fStack_4d4 = local_4b0._12_4_ + auVar11._12_4_ * 0.33333334;
  local_3c0 = vsubps_avx(_local_4b0,auVar155);
  auVar292 = vmovsldup_avx(local_3c0);
  auVar83 = vmovshdup_avx(local_3c0);
  auVar9 = vshufps_avx(local_3c0,local_3c0,0xaa);
  fVar198 = pre->ray_space[k].vx.field_0.m128[0];
  fVar216 = pre->ray_space[k].vx.field_0.m128[1];
  fVar217 = pre->ray_space[k].vx.field_0.m128[2];
  fVar218 = pre->ray_space[k].vx.field_0.m128[3];
  fVar219 = pre->ray_space[k].vy.field_0.m128[0];
  fVar220 = pre->ray_space[k].vy.field_0.m128[1];
  fVar221 = pre->ray_space[k].vy.field_0.m128[2];
  fVar173 = pre->ray_space[k].vy.field_0.m128[3];
  fVar192 = pre->ray_space[k].vz.field_0.m128[0];
  fVar193 = pre->ray_space[k].vz.field_0.m128[1];
  fVar194 = pre->ray_space[k].vz.field_0.m128[2];
  fVar195 = pre->ray_space[k].vz.field_0.m128[3];
  fVar235 = fVar198 * auVar292._0_4_ + auVar9._0_4_ * fVar192 + fVar219 * auVar83._0_4_;
  fVar237 = fVar216 * auVar292._4_4_ + auVar9._4_4_ * fVar193 + fVar220 * auVar83._4_4_;
  local_700._4_4_ = fVar237;
  local_700._0_4_ = fVar235;
  fStack_6f8 = fVar217 * auVar292._8_4_ + auVar9._8_4_ * fVar194 + fVar221 * auVar83._8_4_;
  fStack_6f4 = fVar218 * auVar292._12_4_ + auVar9._12_4_ * fVar195 + fVar173 * auVar83._12_4_;
  local_3d0 = vsubps_avx(_local_4e0,auVar155);
  auVar9 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar83 = vmovshdup_avx(local_3d0);
  auVar292 = vmovsldup_avx(local_3d0);
  fVar236 = auVar292._0_4_ * fVar198 + auVar83._0_4_ * fVar219 + fVar192 * auVar9._0_4_;
  fVar239 = auVar292._4_4_ * fVar216 + auVar83._4_4_ * fVar220 + fVar193 * auVar9._4_4_;
  local_6d0._4_4_ = fVar239;
  local_6d0._0_4_ = fVar236;
  fStack_6c8 = auVar292._8_4_ * fVar217 + auVar83._8_4_ * fVar221 + fVar194 * auVar9._8_4_;
  fStack_6c4 = auVar292._12_4_ * fVar218 + auVar83._12_4_ * fVar173 + fVar195 * auVar9._12_4_;
  auVar204._0_4_ = auVar10._0_4_ * 0.33333334;
  auVar204._4_4_ = auVar10._4_4_ * 0.33333334;
  auVar204._8_4_ = auVar10._8_4_ * 0.33333334;
  auVar204._12_4_ = auVar10._12_4_ * 0.33333334;
  _local_4f0 = vsubps_avx(_local_4d0,auVar204);
  local_3e0 = vsubps_avx(_local_4f0,auVar155);
  auVar9 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar83 = vmovshdup_avx(local_3e0);
  auVar292 = vmovsldup_avx(local_3e0);
  auVar325._0_4_ = auVar292._0_4_ * fVar198 + auVar83._0_4_ * fVar219 + fVar192 * auVar9._0_4_;
  auVar325._4_4_ = auVar292._4_4_ * fVar216 + auVar83._4_4_ * fVar220 + fVar193 * auVar9._4_4_;
  auVar325._8_4_ = auVar292._8_4_ * fVar217 + auVar83._8_4_ * fVar221 + fVar194 * auVar9._8_4_;
  auVar325._12_4_ = auVar292._12_4_ * fVar218 + auVar83._12_4_ * fVar173 + fVar195 * auVar9._12_4_;
  local_3f0 = vsubps_avx(_local_4d0,auVar155);
  auVar9 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar83 = vmovshdup_avx(local_3f0);
  auVar292 = vmovsldup_avx(local_3f0);
  auVar317._0_4_ = auVar292._0_4_ * fVar198 + auVar83._0_4_ * fVar219 + auVar9._0_4_ * fVar192;
  auVar317._4_4_ = auVar292._4_4_ * fVar216 + auVar83._4_4_ * fVar220 + auVar9._4_4_ * fVar193;
  auVar317._8_4_ = auVar292._8_4_ * fVar217 + auVar83._8_4_ * fVar221 + auVar9._8_4_ * fVar194;
  auVar317._12_4_ = auVar292._12_4_ * fVar218 + auVar83._12_4_ * fVar173 + auVar9._12_4_ * fVar195;
  local_400 = vsubps_avx(_local_4c0,auVar155);
  auVar9 = vshufps_avx(local_400,local_400,0xaa);
  auVar83 = vmovshdup_avx(local_400);
  auVar292 = vmovsldup_avx(local_400);
  auVar304._0_4_ = auVar292._0_4_ * fVar198 + auVar83._0_4_ * fVar219 + auVar9._0_4_ * fVar192;
  auVar304._4_4_ = auVar292._4_4_ * fVar216 + auVar83._4_4_ * fVar220 + auVar9._4_4_ * fVar193;
  auVar304._8_4_ = auVar292._8_4_ * fVar217 + auVar83._8_4_ * fVar221 + auVar9._8_4_ * fVar194;
  auVar304._12_4_ = auVar292._12_4_ * fVar218 + auVar83._12_4_ * fVar173 + auVar9._12_4_ * fVar195;
  local_500._0_4_ = (float)local_4c0._0_4_ + (fVar240 + auVar227._0_4_) * 0.33333334;
  local_500._4_4_ = (float)local_4c0._4_4_ + (fVar300 + auVar227._4_4_) * 0.33333334;
  fStack_4f8 = fStack_4b8 + (fVar301 + auVar227._8_4_) * 0.33333334;
  fStack_4f4 = fStack_4b4 + (fVar302 + auVar227._12_4_) * 0.33333334;
  local_410 = vsubps_avx(_local_500,auVar155);
  auVar9 = vshufps_avx(local_410,local_410,0xaa);
  auVar83 = vmovshdup_avx(local_410);
  auVar292 = vmovsldup_avx(local_410);
  auVar258._0_4_ = auVar292._0_4_ * fVar198 + auVar83._0_4_ * fVar219 + auVar9._0_4_ * fVar192;
  auVar258._4_4_ = auVar292._4_4_ * fVar216 + auVar83._4_4_ * fVar220 + auVar9._4_4_ * fVar193;
  auVar258._8_4_ = auVar292._8_4_ * fVar217 + auVar83._8_4_ * fVar221 + auVar9._8_4_ * fVar194;
  auVar258._12_4_ = auVar292._12_4_ * fVar218 + auVar83._12_4_ * fVar173 + auVar9._12_4_ * fVar195;
  auVar245._0_4_ = (fVar303 + auVar108._0_4_) * 0.33333334;
  auVar245._4_4_ = (fVar308 + auVar108._4_4_) * 0.33333334;
  auVar245._8_4_ = (fVar309 + auVar108._8_4_) * 0.33333334;
  auVar245._12_4_ = (fVar310 + auVar108._12_4_) * 0.33333334;
  auVar67._4_4_ = fVar197;
  auVar67._0_4_ = fVar196;
  auVar67._8_4_ = fVar222;
  auVar67._12_4_ = fVar234;
  _local_450 = vsubps_avx(auVar67,auVar245);
  local_420 = vsubps_avx(_local_450,auVar155);
  auVar9 = vshufps_avx(local_420,local_420,0xaa);
  auVar83 = vmovshdup_avx(local_420);
  auVar292 = vmovsldup_avx(local_420);
  auVar109._0_4_ = auVar292._0_4_ * fVar198 + auVar83._0_4_ * fVar219 + fVar192 * auVar9._0_4_;
  auVar109._4_4_ = auVar292._4_4_ * fVar216 + auVar83._4_4_ * fVar220 + fVar193 * auVar9._4_4_;
  auVar109._8_4_ = auVar292._8_4_ * fVar217 + auVar83._8_4_ * fVar221 + fVar194 * auVar9._8_4_;
  auVar109._12_4_ = auVar292._12_4_ * fVar218 + auVar83._12_4_ * fVar173 + fVar195 * auVar9._12_4_;
  local_430 = vsubps_avx(auVar67,auVar155);
  auVar155 = vshufps_avx(local_430,local_430,0xaa);
  auVar83 = vmovshdup_avx(local_430);
  auVar292 = vmovsldup_avx(local_430);
  auVar78._0_4_ = fVar198 * auVar292._0_4_ + fVar219 * auVar83._0_4_ + fVar192 * auVar155._0_4_;
  auVar78._4_4_ = fVar216 * auVar292._4_4_ + fVar220 * auVar83._4_4_ + fVar193 * auVar155._4_4_;
  auVar78._8_4_ = fVar217 * auVar292._8_4_ + fVar221 * auVar83._8_4_ + fVar194 * auVar155._8_4_;
  auVar78._12_4_ = fVar218 * auVar292._12_4_ + fVar173 * auVar83._12_4_ + fVar195 * auVar155._12_4_;
  auVar9 = vmovlhps_avx(_local_700,auVar304);
  auVar10 = vmovlhps_avx(_local_6d0,auVar258);
  auVar11 = vmovlhps_avx(auVar325,auVar109);
  _local_3a0 = vmovlhps_avx(auVar317,auVar78);
  auVar83 = vminps_avx(auVar9,auVar10);
  auVar292 = vminps_avx(auVar11,_local_3a0);
  auVar155 = vminps_avx(auVar83,auVar292);
  auVar83 = vmaxps_avx(auVar9,auVar10);
  auVar292 = vmaxps_avx(auVar11,_local_3a0);
  auVar83 = vmaxps_avx(auVar83,auVar292);
  auVar292 = vshufpd_avx(auVar155,auVar155,3);
  auVar155 = vminps_avx(auVar155,auVar292);
  auVar292 = vshufpd_avx(auVar83,auVar83,3);
  auVar292 = vmaxps_avx(auVar83,auVar292);
  auVar228._8_4_ = 0x7fffffff;
  auVar228._0_8_ = 0x7fffffff7fffffff;
  auVar228._12_4_ = 0x7fffffff;
  auVar83 = vandps_avx(auVar155,auVar228);
  auVar292 = vandps_avx(auVar292,auVar228);
  auVar83 = vmaxps_avx(auVar83,auVar292);
  auVar292 = vmovshdup_avx(auVar83);
  auVar83 = vmaxss_avx(auVar292,auVar83);
  fVar198 = auVar83._0_4_ * 9.536743e-07;
  local_3b0 = ZEXT416((uint)fVar198);
  auVar83 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
  local_1c0._16_16_ = auVar83;
  local_1c0._0_16_ = auVar83;
  auVar79._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
  auVar79._8_4_ = auVar83._8_4_ ^ 0x80000000;
  auVar79._12_4_ = auVar83._12_4_ ^ 0x80000000;
  local_1e0._16_16_ = auVar79;
  local_1e0._0_16_ = auVar79;
  auVar83 = vpshufd_avx(ZEXT416(uVar69),0);
  local_320._16_16_ = auVar83;
  local_320._0_16_ = auVar83;
  auVar83 = vpshufd_avx(ZEXT416(uVar13),0);
  local_340._16_16_ = auVar83;
  local_340._0_16_ = auVar83;
  uVar75 = 0;
  fVar198 = *(float *)(ray + k * 4 + 0x60);
  _local_370 = vsubps_avx(auVar10,auVar9);
  _local_380 = vsubps_avx(auVar11,auVar10);
  _local_390 = vsubps_avx(_local_3a0,auVar11);
  _local_460 = vsubps_avx(_local_4c0,_local_4b0);
  _local_470 = vsubps_avx(_local_500,_local_4e0);
  _local_480 = vsubps_avx(_local_450,_local_4f0);
  auVar68._4_4_ = fVar197;
  auVar68._0_4_ = fVar196;
  auVar68._8_4_ = fVar222;
  auVar68._12_4_ = fVar234;
  _local_490 = vsubps_avx(auVar68,_local_4d0);
  auVar333 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar340 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_0099c483:
  do {
    local_440 = auVar340._0_16_;
    auVar106 = auVar333._0_16_;
    auVar83 = vshufps_avx(auVar106,auVar106,0x50);
    auVar326._8_4_ = 0x3f800000;
    auVar326._0_8_ = 0x3f8000003f800000;
    auVar326._12_4_ = 0x3f800000;
    auVar332._16_4_ = 0x3f800000;
    auVar332._0_16_ = auVar326;
    auVar332._20_4_ = 0x3f800000;
    auVar332._24_4_ = 0x3f800000;
    auVar332._28_4_ = 0x3f800000;
    auVar292 = vsubps_avx(auVar326,auVar83);
    fVar216 = auVar83._0_4_;
    fVar217 = auVar83._4_4_;
    fVar218 = auVar83._8_4_;
    fVar219 = auVar83._12_4_;
    fVar220 = auVar292._0_4_;
    fVar221 = auVar292._4_4_;
    fVar173 = auVar292._8_4_;
    fVar192 = auVar292._12_4_;
    auVar164._0_4_ = auVar304._0_4_ * fVar216 + fVar220 * fVar235;
    auVar164._4_4_ = auVar304._4_4_ * fVar217 + fVar221 * fVar237;
    auVar164._8_4_ = auVar304._0_4_ * fVar218 + fVar173 * fVar235;
    auVar164._12_4_ = auVar304._4_4_ * fVar219 + fVar192 * fVar237;
    auVar138._0_4_ = auVar258._0_4_ * fVar216 + fVar220 * fVar236;
    auVar138._4_4_ = auVar258._4_4_ * fVar217 + fVar221 * fVar239;
    auVar138._8_4_ = auVar258._0_4_ * fVar218 + fVar173 * fVar236;
    auVar138._12_4_ = auVar258._4_4_ * fVar219 + fVar192 * fVar239;
    auVar246._0_4_ = auVar109._0_4_ * fVar216 + auVar325._0_4_ * fVar220;
    auVar246._4_4_ = auVar109._4_4_ * fVar217 + auVar325._4_4_ * fVar221;
    auVar246._8_4_ = auVar109._0_4_ * fVar218 + auVar325._0_4_ * fVar173;
    auVar246._12_4_ = auVar109._4_4_ * fVar219 + auVar325._4_4_ * fVar192;
    auVar177._0_4_ = auVar78._0_4_ * fVar216 + auVar317._0_4_ * fVar220;
    auVar177._4_4_ = auVar78._4_4_ * fVar217 + auVar317._4_4_ * fVar221;
    auVar177._8_4_ = auVar78._0_4_ * fVar218 + auVar317._0_4_ * fVar173;
    auVar177._12_4_ = auVar78._4_4_ * fVar219 + auVar317._4_4_ * fVar192;
    auVar83 = vmovshdup_avx(local_440);
    auVar292 = vshufps_avx(local_440,local_440,0);
    auVar275._16_16_ = auVar292;
    auVar275._0_16_ = auVar292;
    auVar155 = vshufps_avx(local_440,local_440,0x55);
    auVar98._16_16_ = auVar155;
    auVar98._0_16_ = auVar155;
    auVar94 = vsubps_avx(auVar98,auVar275);
    auVar155 = vshufps_avx(auVar164,auVar164,0);
    auVar124 = vshufps_avx(auVar164,auVar164,0x55);
    auVar112 = vshufps_avx(auVar138,auVar138,0);
    auVar141 = vshufps_avx(auVar138,auVar138,0x55);
    auVar113 = vshufps_avx(auVar246,auVar246,0);
    auVar238 = vshufps_avx(auVar246,auVar246,0x55);
    auVar268 = vshufps_avx(auVar177,auVar177,0);
    auVar77 = vshufps_avx(auVar177,auVar177,0x55);
    auVar83 = ZEXT416((uint)((auVar83._0_4_ - auVar340._0_4_) * 0.04761905));
    auVar83 = vshufps_avx(auVar83,auVar83,0);
    auVar289._0_4_ = auVar292._0_4_ + auVar94._0_4_ * 0.0;
    auVar289._4_4_ = auVar292._4_4_ + auVar94._4_4_ * 0.14285715;
    auVar289._8_4_ = auVar292._8_4_ + auVar94._8_4_ * 0.2857143;
    auVar289._12_4_ = auVar292._12_4_ + auVar94._12_4_ * 0.42857146;
    auVar289._16_4_ = auVar292._0_4_ + auVar94._16_4_ * 0.5714286;
    auVar289._20_4_ = auVar292._4_4_ + auVar94._20_4_ * 0.71428573;
    auVar289._24_4_ = auVar292._8_4_ + auVar94._24_4_ * 0.8571429;
    auVar289._28_4_ = auVar292._12_4_ + auVar94._28_4_;
    auVar21 = vsubps_avx(auVar332,auVar289);
    fVar216 = auVar112._0_4_;
    fVar218 = auVar112._4_4_;
    fVar220 = auVar112._8_4_;
    fVar173 = auVar112._12_4_;
    fVar263 = auVar21._0_4_;
    fVar277 = auVar21._4_4_;
    fVar278 = auVar21._8_4_;
    fVar279 = auVar21._12_4_;
    fVar280 = auVar21._16_4_;
    fVar281 = auVar21._20_4_;
    fVar282 = auVar21._24_4_;
    fVar320 = auVar141._0_4_;
    fVar322 = auVar141._4_4_;
    fVar334 = auVar141._8_4_;
    fVar336 = auVar141._12_4_;
    fVar323 = auVar124._12_4_ + 1.0;
    fVar308 = auVar113._0_4_;
    fVar309 = auVar113._4_4_;
    fVar310 = auVar113._8_4_;
    fVar316 = auVar113._12_4_;
    fVar193 = fVar308 * auVar289._0_4_ + fVar263 * fVar216;
    fVar194 = fVar309 * auVar289._4_4_ + fVar277 * fVar218;
    fVar195 = fVar310 * auVar289._8_4_ + fVar278 * fVar220;
    fVar240 = fVar316 * auVar289._12_4_ + fVar279 * fVar173;
    fVar300 = fVar308 * auVar289._16_4_ + fVar280 * fVar216;
    fVar301 = fVar309 * auVar289._20_4_ + fVar281 * fVar218;
    fVar302 = fVar310 * auVar289._24_4_ + fVar282 * fVar220;
    fVar217 = auVar238._0_4_;
    fVar219 = auVar238._4_4_;
    fVar221 = auVar238._8_4_;
    fVar192 = auVar238._12_4_;
    fVar321 = fVar320 * fVar263 + auVar289._0_4_ * fVar217;
    fVar324 = fVar322 * fVar277 + auVar289._4_4_ * fVar219;
    fVar335 = fVar334 * fVar278 + auVar289._8_4_ * fVar221;
    fVar311 = fVar336 * fVar279 + auVar289._12_4_ * fVar192;
    fVar312 = fVar320 * fVar280 + auVar289._16_4_ * fVar217;
    fVar313 = fVar322 * fVar281 + auVar289._20_4_ * fVar219;
    fVar314 = fVar334 * fVar282 + auVar289._24_4_ * fVar221;
    fVar315 = fVar336 + fVar173;
    auVar292 = vshufps_avx(auVar164,auVar164,0xaa);
    auVar112 = vshufps_avx(auVar164,auVar164,0xff);
    fVar303 = fVar316 + 0.0;
    auVar141 = vshufps_avx(auVar138,auVar138,0xaa);
    auVar113 = vshufps_avx(auVar138,auVar138,0xff);
    auVar190._0_4_ =
         fVar263 * (auVar289._0_4_ * fVar216 + fVar263 * auVar155._0_4_) + auVar289._0_4_ * fVar193;
    auVar190._4_4_ =
         fVar277 * (auVar289._4_4_ * fVar218 + fVar277 * auVar155._4_4_) + auVar289._4_4_ * fVar194;
    auVar190._8_4_ =
         fVar278 * (auVar289._8_4_ * fVar220 + fVar278 * auVar155._8_4_) + auVar289._8_4_ * fVar195;
    auVar190._12_4_ =
         fVar279 * (auVar289._12_4_ * fVar173 + fVar279 * auVar155._12_4_) +
         auVar289._12_4_ * fVar240;
    auVar190._16_4_ =
         fVar280 * (auVar289._16_4_ * fVar216 + fVar280 * auVar155._0_4_) +
         auVar289._16_4_ * fVar300;
    auVar190._20_4_ =
         fVar281 * (auVar289._20_4_ * fVar218 + fVar281 * auVar155._4_4_) +
         auVar289._20_4_ * fVar301;
    auVar190._24_4_ =
         fVar282 * (auVar289._24_4_ * fVar220 + fVar282 * auVar155._8_4_) +
         auVar289._24_4_ * fVar302;
    auVar190._28_4_ = auVar155._12_4_ + 1.0 + fVar192;
    auVar214._0_4_ =
         fVar263 * (fVar320 * auVar289._0_4_ + auVar124._0_4_ * fVar263) + auVar289._0_4_ * fVar321;
    auVar214._4_4_ =
         fVar277 * (fVar322 * auVar289._4_4_ + auVar124._4_4_ * fVar277) + auVar289._4_4_ * fVar324;
    auVar214._8_4_ =
         fVar278 * (fVar334 * auVar289._8_4_ + auVar124._8_4_ * fVar278) + auVar289._8_4_ * fVar335;
    auVar214._12_4_ =
         fVar279 * (fVar336 * auVar289._12_4_ + auVar124._12_4_ * fVar279) +
         auVar289._12_4_ * fVar311;
    auVar214._16_4_ =
         fVar280 * (fVar320 * auVar289._16_4_ + auVar124._0_4_ * fVar280) +
         auVar289._16_4_ * fVar312;
    auVar214._20_4_ =
         fVar281 * (fVar322 * auVar289._20_4_ + auVar124._4_4_ * fVar281) +
         auVar289._20_4_ * fVar313;
    auVar214._24_4_ =
         fVar282 * (fVar334 * auVar289._24_4_ + auVar124._8_4_ * fVar282) +
         auVar289._24_4_ * fVar314;
    auVar214._28_4_ = auVar77._12_4_ + fVar192;
    auVar99._0_4_ =
         fVar263 * fVar193 + auVar289._0_4_ * (fVar308 * fVar263 + auVar268._0_4_ * auVar289._0_4_);
    auVar99._4_4_ =
         fVar277 * fVar194 + auVar289._4_4_ * (fVar309 * fVar277 + auVar268._4_4_ * auVar289._4_4_);
    auVar99._8_4_ =
         fVar278 * fVar195 + auVar289._8_4_ * (fVar310 * fVar278 + auVar268._8_4_ * auVar289._8_4_);
    auVar99._12_4_ =
         fVar279 * fVar240 +
         auVar289._12_4_ * (fVar316 * fVar279 + auVar268._12_4_ * auVar289._12_4_);
    auVar99._16_4_ =
         fVar280 * fVar300 +
         auVar289._16_4_ * (fVar308 * fVar280 + auVar268._0_4_ * auVar289._16_4_);
    auVar99._20_4_ =
         fVar281 * fVar301 +
         auVar289._20_4_ * (fVar309 * fVar281 + auVar268._4_4_ * auVar289._20_4_);
    auVar99._24_4_ =
         fVar282 * fVar302 +
         auVar289._24_4_ * (fVar310 * fVar282 + auVar268._8_4_ * auVar289._24_4_);
    auVar99._28_4_ = fVar173 + 1.0 + fVar303;
    auVar299._0_4_ =
         fVar263 * fVar321 + auVar289._0_4_ * (auVar77._0_4_ * auVar289._0_4_ + fVar263 * fVar217);
    auVar299._4_4_ =
         fVar277 * fVar324 + auVar289._4_4_ * (auVar77._4_4_ * auVar289._4_4_ + fVar277 * fVar219);
    auVar299._8_4_ =
         fVar278 * fVar335 + auVar289._8_4_ * (auVar77._8_4_ * auVar289._8_4_ + fVar278 * fVar221);
    auVar299._12_4_ =
         fVar279 * fVar311 +
         auVar289._12_4_ * (auVar77._12_4_ * auVar289._12_4_ + fVar279 * fVar192);
    auVar299._16_4_ =
         fVar280 * fVar312 + auVar289._16_4_ * (auVar77._0_4_ * auVar289._16_4_ + fVar280 * fVar217)
    ;
    auVar299._20_4_ =
         fVar281 * fVar313 + auVar289._20_4_ * (auVar77._4_4_ * auVar289._20_4_ + fVar281 * fVar219)
    ;
    auVar299._24_4_ =
         fVar282 * fVar314 + auVar289._24_4_ * (auVar77._8_4_ * auVar289._24_4_ + fVar282 * fVar221)
    ;
    auVar299._28_4_ = fVar303 + fVar192 + 0.0;
    local_220._0_4_ = fVar263 * auVar190._0_4_ + auVar289._0_4_ * auVar99._0_4_;
    local_220._4_4_ = fVar277 * auVar190._4_4_ + auVar289._4_4_ * auVar99._4_4_;
    local_220._8_4_ = fVar278 * auVar190._8_4_ + auVar289._8_4_ * auVar99._8_4_;
    local_220._12_4_ = fVar279 * auVar190._12_4_ + auVar289._12_4_ * auVar99._12_4_;
    local_220._16_4_ = fVar280 * auVar190._16_4_ + auVar289._16_4_ * auVar99._16_4_;
    local_220._20_4_ = fVar281 * auVar190._20_4_ + auVar289._20_4_ * auVar99._20_4_;
    local_220._24_4_ = fVar282 * auVar190._24_4_ + auVar289._24_4_ * auVar99._24_4_;
    local_220._28_4_ = fVar315 + fVar192 + 0.0;
    auVar172._0_4_ = fVar263 * auVar214._0_4_ + auVar289._0_4_ * auVar299._0_4_;
    auVar172._4_4_ = fVar277 * auVar214._4_4_ + auVar289._4_4_ * auVar299._4_4_;
    auVar172._8_4_ = fVar278 * auVar214._8_4_ + auVar289._8_4_ * auVar299._8_4_;
    auVar172._12_4_ = fVar279 * auVar214._12_4_ + auVar289._12_4_ * auVar299._12_4_;
    auVar172._16_4_ = fVar280 * auVar214._16_4_ + auVar289._16_4_ * auVar299._16_4_;
    auVar172._20_4_ = fVar281 * auVar214._20_4_ + auVar289._20_4_ * auVar299._20_4_;
    auVar172._24_4_ = fVar282 * auVar214._24_4_ + auVar289._24_4_ * auVar299._24_4_;
    auVar172._28_4_ = fVar315 + fVar303;
    auVar22 = vsubps_avx(auVar99,auVar190);
    auVar94 = vsubps_avx(auVar299,auVar214);
    local_680 = auVar83._0_4_;
    fStack_67c = auVar83._4_4_;
    fStack_678 = auVar83._8_4_;
    fStack_674 = auVar83._12_4_;
    local_260 = local_680 * auVar22._0_4_ * 3.0;
    fStack_25c = fStack_67c * auVar22._4_4_ * 3.0;
    auVar29._4_4_ = fStack_25c;
    auVar29._0_4_ = local_260;
    fStack_258 = fStack_678 * auVar22._8_4_ * 3.0;
    auVar29._8_4_ = fStack_258;
    fStack_254 = fStack_674 * auVar22._12_4_ * 3.0;
    auVar29._12_4_ = fStack_254;
    fStack_250 = local_680 * auVar22._16_4_ * 3.0;
    auVar29._16_4_ = fStack_250;
    fStack_24c = fStack_67c * auVar22._20_4_ * 3.0;
    auVar29._20_4_ = fStack_24c;
    fStack_248 = fStack_678 * auVar22._24_4_ * 3.0;
    auVar29._24_4_ = fStack_248;
    auVar29._28_4_ = auVar22._28_4_;
    local_280 = local_680 * auVar94._0_4_ * 3.0;
    fStack_27c = fStack_67c * auVar94._4_4_ * 3.0;
    auVar30._4_4_ = fStack_27c;
    auVar30._0_4_ = local_280;
    fStack_278 = fStack_678 * auVar94._8_4_ * 3.0;
    auVar30._8_4_ = fStack_278;
    fStack_274 = fStack_674 * auVar94._12_4_ * 3.0;
    auVar30._12_4_ = fStack_274;
    fStack_270 = local_680 * auVar94._16_4_ * 3.0;
    auVar30._16_4_ = fStack_270;
    fStack_26c = fStack_67c * auVar94._20_4_ * 3.0;
    auVar30._20_4_ = fStack_26c;
    fStack_268 = fStack_678 * auVar94._24_4_ * 3.0;
    auVar30._24_4_ = fStack_268;
    auVar30._28_4_ = fVar315;
    auVar19 = vsubps_avx(local_220,auVar29);
    auVar94 = vperm2f128_avx(auVar19,auVar19,1);
    auVar94 = vshufps_avx(auVar94,auVar19,0x30);
    auVar94 = vshufps_avx(auVar19,auVar94,0x29);
    auVar20 = vsubps_avx(auVar172,auVar30);
    auVar19 = vperm2f128_avx(auVar20,auVar20,1);
    auVar19 = vshufps_avx(auVar19,auVar20,0x30);
    auVar20 = vshufps_avx(auVar20,auVar19,0x29);
    fVar313 = auVar141._0_4_;
    fVar314 = auVar141._4_4_;
    fVar341 = auVar141._8_4_;
    fVar173 = auVar292._12_4_;
    fVar309 = auVar113._0_4_;
    fVar316 = auVar113._4_4_;
    fVar321 = auVar113._8_4_;
    fVar324 = auVar113._12_4_;
    auVar83 = vshufps_avx(auVar246,auVar246,0xaa);
    fVar216 = auVar83._0_4_;
    fVar218 = auVar83._4_4_;
    fVar220 = auVar83._8_4_;
    fVar192 = auVar83._12_4_;
    fVar195 = auVar289._0_4_ * fVar216 + fVar313 * fVar263;
    fVar240 = auVar289._4_4_ * fVar218 + fVar314 * fVar277;
    fVar300 = auVar289._8_4_ * fVar220 + fVar341 * fVar278;
    fVar301 = auVar289._12_4_ * fVar192 + auVar141._12_4_ * fVar279;
    fVar302 = auVar289._16_4_ * fVar216 + fVar313 * fVar280;
    fVar303 = auVar289._20_4_ * fVar218 + fVar314 * fVar281;
    fVar308 = auVar289._24_4_ * fVar220 + fVar341 * fVar282;
    auVar83 = vshufps_avx(auVar246,auVar246,0xff);
    fVar217 = auVar83._0_4_;
    fVar219 = auVar83._4_4_;
    fVar221 = auVar83._8_4_;
    fVar193 = auVar83._12_4_;
    fVar310 = auVar289._0_4_ * fVar217 + fVar309 * fVar263;
    fVar320 = auVar289._4_4_ * fVar219 + fVar316 * fVar277;
    fVar322 = auVar289._8_4_ * fVar221 + fVar321 * fVar278;
    fVar334 = auVar289._12_4_ * fVar193 + fVar324 * fVar279;
    fVar335 = auVar289._16_4_ * fVar217 + fVar309 * fVar280;
    fVar336 = auVar289._20_4_ * fVar219 + fVar316 * fVar281;
    fVar311 = auVar289._24_4_ * fVar221 + fVar321 * fVar282;
    auVar83 = vshufps_avx(auVar177,auVar177,0xaa);
    fVar312 = auVar83._12_4_ + fVar192;
    auVar155 = vshufps_avx(auVar177,auVar177,0xff);
    fVar194 = auVar155._12_4_;
    auVar100._0_4_ =
         fVar263 * (fVar313 * auVar289._0_4_ + fVar263 * auVar292._0_4_) + auVar289._0_4_ * fVar195;
    auVar100._4_4_ =
         fVar277 * (fVar314 * auVar289._4_4_ + fVar277 * auVar292._4_4_) + auVar289._4_4_ * fVar240;
    auVar100._8_4_ =
         fVar278 * (fVar341 * auVar289._8_4_ + fVar278 * auVar292._8_4_) + auVar289._8_4_ * fVar300;
    auVar100._12_4_ =
         fVar279 * (auVar141._12_4_ * auVar289._12_4_ + fVar279 * fVar173) +
         auVar289._12_4_ * fVar301;
    auVar100._16_4_ =
         fVar280 * (fVar313 * auVar289._16_4_ + fVar280 * auVar292._0_4_) +
         auVar289._16_4_ * fVar302;
    auVar100._20_4_ =
         fVar281 * (fVar314 * auVar289._20_4_ + fVar281 * auVar292._4_4_) +
         auVar289._20_4_ * fVar303;
    auVar100._24_4_ =
         fVar282 * (fVar341 * auVar289._24_4_ + fVar282 * auVar292._8_4_) +
         auVar289._24_4_ * fVar308;
    auVar100._28_4_ = auVar20._28_4_ + fVar173 + fVar194;
    auVar131._0_4_ =
         fVar263 * (fVar309 * auVar289._0_4_ + auVar112._0_4_ * fVar263) + auVar289._0_4_ * fVar310;
    auVar131._4_4_ =
         fVar277 * (fVar316 * auVar289._4_4_ + auVar112._4_4_ * fVar277) + auVar289._4_4_ * fVar320;
    auVar131._8_4_ =
         fVar278 * (fVar321 * auVar289._8_4_ + auVar112._8_4_ * fVar278) + auVar289._8_4_ * fVar322;
    auVar131._12_4_ =
         fVar279 * (fVar324 * auVar289._12_4_ + auVar112._12_4_ * fVar279) +
         auVar289._12_4_ * fVar334;
    auVar131._16_4_ =
         fVar280 * (fVar309 * auVar289._16_4_ + auVar112._0_4_ * fVar280) +
         auVar289._16_4_ * fVar335;
    auVar131._20_4_ =
         fVar281 * (fVar316 * auVar289._20_4_ + auVar112._4_4_ * fVar281) +
         auVar289._20_4_ * fVar336;
    auVar131._24_4_ =
         fVar282 * (fVar321 * auVar289._24_4_ + auVar112._8_4_ * fVar282) +
         auVar289._24_4_ * fVar311;
    auVar131._28_4_ = fVar173 + auVar19._28_4_ + fVar194;
    auVar19 = vperm2f128_avx(local_220,local_220,1);
    auVar19 = vshufps_avx(auVar19,local_220,0x30);
    _local_520 = vshufps_avx(local_220,auVar19,0x29);
    auVar215._0_4_ =
         auVar289._0_4_ * (auVar83._0_4_ * auVar289._0_4_ + fVar263 * fVar216) + fVar263 * fVar195;
    auVar215._4_4_ =
         auVar289._4_4_ * (auVar83._4_4_ * auVar289._4_4_ + fVar277 * fVar218) + fVar277 * fVar240;
    auVar215._8_4_ =
         auVar289._8_4_ * (auVar83._8_4_ * auVar289._8_4_ + fVar278 * fVar220) + fVar278 * fVar300;
    auVar215._12_4_ =
         auVar289._12_4_ * (auVar83._12_4_ * auVar289._12_4_ + fVar279 * fVar192) +
         fVar279 * fVar301;
    auVar215._16_4_ =
         auVar289._16_4_ * (auVar83._0_4_ * auVar289._16_4_ + fVar280 * fVar216) + fVar280 * fVar302
    ;
    auVar215._20_4_ =
         auVar289._20_4_ * (auVar83._4_4_ * auVar289._20_4_ + fVar281 * fVar218) + fVar281 * fVar303
    ;
    auVar215._24_4_ =
         auVar289._24_4_ * (auVar83._8_4_ * auVar289._24_4_ + fVar282 * fVar220) + fVar282 * fVar308
    ;
    auVar215._28_4_ = fVar312 + fVar323 + auVar214._28_4_;
    auVar262._0_4_ =
         fVar263 * fVar310 + auVar289._0_4_ * (auVar289._0_4_ * auVar155._0_4_ + fVar263 * fVar217);
    auVar262._4_4_ =
         fVar277 * fVar320 + auVar289._4_4_ * (auVar289._4_4_ * auVar155._4_4_ + fVar277 * fVar219);
    auVar262._8_4_ =
         fVar278 * fVar322 + auVar289._8_4_ * (auVar289._8_4_ * auVar155._8_4_ + fVar278 * fVar221);
    auVar262._12_4_ =
         fVar279 * fVar334 + auVar289._12_4_ * (auVar289._12_4_ * fVar194 + fVar279 * fVar193);
    auVar262._16_4_ =
         fVar280 * fVar335 +
         auVar289._16_4_ * (auVar289._16_4_ * auVar155._0_4_ + fVar280 * fVar217);
    auVar262._20_4_ =
         fVar281 * fVar336 +
         auVar289._20_4_ * (auVar289._20_4_ * auVar155._4_4_ + fVar281 * fVar219);
    auVar262._24_4_ =
         fVar282 * fVar311 +
         auVar289._24_4_ * (auVar289._24_4_ * auVar155._8_4_ + fVar282 * fVar221);
    auVar262._28_4_ = fVar323 + fVar324 + fVar194 + fVar193;
    auVar254._0_4_ = fVar263 * auVar100._0_4_ + auVar289._0_4_ * auVar215._0_4_;
    auVar254._4_4_ = fVar277 * auVar100._4_4_ + auVar289._4_4_ * auVar215._4_4_;
    auVar254._8_4_ = fVar278 * auVar100._8_4_ + auVar289._8_4_ * auVar215._8_4_;
    auVar254._12_4_ = fVar279 * auVar100._12_4_ + auVar289._12_4_ * auVar215._12_4_;
    auVar254._16_4_ = fVar280 * auVar100._16_4_ + auVar289._16_4_ * auVar215._16_4_;
    auVar254._20_4_ = fVar281 * auVar100._20_4_ + auVar289._20_4_ * auVar215._20_4_;
    auVar254._24_4_ = fVar282 * auVar100._24_4_ + auVar289._24_4_ * auVar215._24_4_;
    auVar254._28_4_ = fVar312 + fVar194 + fVar193;
    auVar276._0_4_ = fVar263 * auVar131._0_4_ + auVar289._0_4_ * auVar262._0_4_;
    auVar276._4_4_ = fVar277 * auVar131._4_4_ + auVar289._4_4_ * auVar262._4_4_;
    auVar276._8_4_ = fVar278 * auVar131._8_4_ + auVar289._8_4_ * auVar262._8_4_;
    auVar276._12_4_ = fVar279 * auVar131._12_4_ + auVar289._12_4_ * auVar262._12_4_;
    auVar276._16_4_ = fVar280 * auVar131._16_4_ + auVar289._16_4_ * auVar262._16_4_;
    auVar276._20_4_ = fVar281 * auVar131._20_4_ + auVar289._20_4_ * auVar262._20_4_;
    auVar276._24_4_ = fVar282 * auVar131._24_4_ + auVar289._24_4_ * auVar262._24_4_;
    auVar276._28_4_ = auVar21._28_4_ + auVar289._28_4_;
    auVar25 = vsubps_avx(auVar215,auVar100);
    auVar19 = vsubps_avx(auVar262,auVar131);
    local_2a0 = local_680 * auVar25._0_4_ * 3.0;
    fStack_29c = fStack_67c * auVar25._4_4_ * 3.0;
    auVar31._4_4_ = fStack_29c;
    auVar31._0_4_ = local_2a0;
    fStack_298 = fStack_678 * auVar25._8_4_ * 3.0;
    auVar31._8_4_ = fStack_298;
    fStack_294 = fStack_674 * auVar25._12_4_ * 3.0;
    auVar31._12_4_ = fStack_294;
    fStack_290 = local_680 * auVar25._16_4_ * 3.0;
    auVar31._16_4_ = fStack_290;
    fStack_28c = fStack_67c * auVar25._20_4_ * 3.0;
    auVar31._20_4_ = fStack_28c;
    fStack_288 = fStack_678 * auVar25._24_4_ * 3.0;
    auVar31._24_4_ = fStack_288;
    auVar31._28_4_ = auVar25._28_4_;
    local_2c0 = local_680 * auVar19._0_4_ * 3.0;
    fStack_2bc = fStack_67c * auVar19._4_4_ * 3.0;
    auVar32._4_4_ = fStack_2bc;
    auVar32._0_4_ = local_2c0;
    fStack_2b8 = fStack_678 * auVar19._8_4_ * 3.0;
    auVar32._8_4_ = fStack_2b8;
    fStack_2b4 = fStack_674 * auVar19._12_4_ * 3.0;
    auVar32._12_4_ = fStack_2b4;
    fStack_2b0 = local_680 * auVar19._16_4_ * 3.0;
    auVar32._16_4_ = fStack_2b0;
    fStack_2ac = fStack_67c * auVar19._20_4_ * 3.0;
    auVar32._20_4_ = fStack_2ac;
    fStack_2a8 = fStack_678 * auVar19._24_4_ * 3.0;
    auVar32._24_4_ = fStack_2a8;
    auVar32._28_4_ = auVar215._28_4_;
    auVar19 = vperm2f128_avx(auVar254,auVar254,1);
    auVar19 = vshufps_avx(auVar19,auVar254,0x30);
    auVar23 = vshufps_avx(auVar254,auVar19,0x29);
    auVar21 = vsubps_avx(auVar254,auVar31);
    auVar19 = vperm2f128_avx(auVar21,auVar21,1);
    auVar19 = vshufps_avx(auVar19,auVar21,0x30);
    auVar19 = vshufps_avx(auVar21,auVar19,0x29);
    auVar24 = vsubps_avx(auVar276,auVar32);
    auVar21 = vperm2f128_avx(auVar24,auVar24,1);
    auVar21 = vshufps_avx(auVar21,auVar24,0x30);
    local_200 = vshufps_avx(auVar24,auVar21,0x29);
    auVar26 = vsubps_avx(auVar254,local_220);
    auVar27 = vsubps_avx(auVar23,_local_520);
    fVar216 = auVar27._0_4_ + auVar26._0_4_;
    fVar217 = auVar27._4_4_ + auVar26._4_4_;
    fVar218 = auVar27._8_4_ + auVar26._8_4_;
    fVar219 = auVar27._12_4_ + auVar26._12_4_;
    fVar220 = auVar27._16_4_ + auVar26._16_4_;
    fVar221 = auVar27._20_4_ + auVar26._20_4_;
    fVar173 = auVar27._24_4_ + auVar26._24_4_;
    auVar21 = vperm2f128_avx(auVar172,auVar172,1);
    auVar21 = vshufps_avx(auVar21,auVar172,0x30);
    local_240 = vshufps_avx(auVar172,auVar21,0x29);
    auVar21 = vperm2f128_avx(auVar276,auVar276,1);
    auVar21 = vshufps_avx(auVar21,auVar276,0x30);
    auVar24 = vshufps_avx(auVar276,auVar21,0x29);
    auVar21 = vsubps_avx(auVar276,auVar172);
    auVar28 = vsubps_avx(auVar24,local_240);
    fVar192 = auVar28._0_4_ + auVar21._0_4_;
    fVar193 = auVar28._4_4_ + auVar21._4_4_;
    fVar194 = auVar28._8_4_ + auVar21._8_4_;
    fVar195 = auVar28._12_4_ + auVar21._12_4_;
    fVar240 = auVar28._16_4_ + auVar21._16_4_;
    fVar300 = auVar28._20_4_ + auVar21._20_4_;
    fVar301 = auVar28._24_4_ + auVar21._24_4_;
    auVar33._4_4_ = fVar217 * auVar172._4_4_;
    auVar33._0_4_ = fVar216 * auVar172._0_4_;
    auVar33._8_4_ = fVar218 * auVar172._8_4_;
    auVar33._12_4_ = fVar219 * auVar172._12_4_;
    auVar33._16_4_ = fVar220 * auVar172._16_4_;
    auVar33._20_4_ = fVar221 * auVar172._20_4_;
    auVar33._24_4_ = fVar173 * auVar172._24_4_;
    auVar33._28_4_ = auVar21._28_4_;
    auVar34._4_4_ = fVar193 * local_220._4_4_;
    auVar34._0_4_ = fVar192 * local_220._0_4_;
    auVar34._8_4_ = fVar194 * local_220._8_4_;
    auVar34._12_4_ = fVar195 * local_220._12_4_;
    auVar34._16_4_ = fVar240 * local_220._16_4_;
    auVar34._20_4_ = fVar300 * local_220._20_4_;
    auVar34._24_4_ = fVar301 * local_220._24_4_;
    auVar34._28_4_ = fVar312;
    auVar95 = vsubps_avx(auVar33,auVar34);
    local_260 = local_220._0_4_ + local_260;
    fStack_25c = local_220._4_4_ + fStack_25c;
    fStack_258 = local_220._8_4_ + fStack_258;
    fStack_254 = local_220._12_4_ + fStack_254;
    fStack_250 = local_220._16_4_ + fStack_250;
    fStack_24c = local_220._20_4_ + fStack_24c;
    fStack_248 = local_220._24_4_ + fStack_248;
    fStack_244 = local_220._28_4_ + auVar22._28_4_;
    local_280 = local_280 + auVar172._0_4_;
    fStack_27c = fStack_27c + auVar172._4_4_;
    fStack_278 = fStack_278 + auVar172._8_4_;
    fStack_274 = fStack_274 + auVar172._12_4_;
    fStack_270 = fStack_270 + auVar172._16_4_;
    fStack_26c = fStack_26c + auVar172._20_4_;
    fStack_268 = fStack_268 + auVar172._24_4_;
    fStack_264 = fVar315 + auVar172._28_4_;
    auVar35._4_4_ = fVar217 * fStack_27c;
    auVar35._0_4_ = fVar216 * local_280;
    auVar35._8_4_ = fVar218 * fStack_278;
    auVar35._12_4_ = fVar219 * fStack_274;
    auVar35._16_4_ = fVar220 * fStack_270;
    auVar35._20_4_ = fVar221 * fStack_26c;
    auVar35._24_4_ = fVar173 * fStack_268;
    auVar35._28_4_ = fVar315;
    auVar36._4_4_ = fVar193 * fStack_25c;
    auVar36._0_4_ = fVar192 * local_260;
    auVar36._8_4_ = fVar194 * fStack_258;
    auVar36._12_4_ = fVar195 * fStack_254;
    auVar36._16_4_ = fVar240 * fStack_250;
    auVar36._20_4_ = fVar300 * fStack_24c;
    auVar36._24_4_ = fVar301 * fStack_248;
    auVar36._28_4_ = fVar315 + auVar172._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar36);
    local_6a0 = auVar20._0_4_;
    fStack_69c = auVar20._4_4_;
    fStack_698 = auVar20._8_4_;
    fStack_694 = auVar20._12_4_;
    fStack_690 = auVar20._16_4_;
    fStack_68c = auVar20._20_4_;
    fStack_688 = auVar20._24_4_;
    auVar37._4_4_ = fVar217 * fStack_69c;
    auVar37._0_4_ = fVar216 * local_6a0;
    auVar37._8_4_ = fVar218 * fStack_698;
    auVar37._12_4_ = fVar219 * fStack_694;
    auVar37._16_4_ = fVar220 * fStack_690;
    auVar37._20_4_ = fVar221 * fStack_68c;
    auVar37._24_4_ = fVar173 * fStack_688;
    auVar37._28_4_ = fVar315;
    local_700._0_4_ = auVar94._0_4_;
    local_700._4_4_ = auVar94._4_4_;
    fStack_6f8 = auVar94._8_4_;
    fStack_6f4 = auVar94._12_4_;
    fStack_6f0 = auVar94._16_4_;
    fStack_6ec = auVar94._20_4_;
    fStack_6e8 = auVar94._24_4_;
    auVar38._4_4_ = fVar193 * (float)local_700._4_4_;
    auVar38._0_4_ = fVar192 * (float)local_700._0_4_;
    auVar38._8_4_ = fVar194 * fStack_6f8;
    auVar38._12_4_ = fVar195 * fStack_6f4;
    auVar38._16_4_ = fVar240 * fStack_6f0;
    auVar38._20_4_ = fVar300 * fStack_6ec;
    auVar38._24_4_ = fVar301 * fStack_6e8;
    auVar38._28_4_ = local_220._28_4_;
    auVar96 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = local_240._4_4_ * fVar217;
    auVar39._0_4_ = local_240._0_4_ * fVar216;
    auVar39._8_4_ = local_240._8_4_ * fVar218;
    auVar39._12_4_ = local_240._12_4_ * fVar219;
    auVar39._16_4_ = local_240._16_4_ * fVar220;
    auVar39._20_4_ = local_240._20_4_ * fVar221;
    auVar39._24_4_ = local_240._24_4_ * fVar173;
    auVar39._28_4_ = fVar315;
    auVar40._4_4_ = local_520._4_4_ * fVar193;
    auVar40._0_4_ = local_520._0_4_ * fVar192;
    auVar40._8_4_ = local_520._8_4_ * fVar194;
    auVar40._12_4_ = local_520._12_4_ * fVar195;
    auVar40._16_4_ = local_520._16_4_ * fVar240;
    auVar40._20_4_ = local_520._20_4_ * fVar300;
    auVar40._24_4_ = local_520._24_4_ * fVar301;
    auVar40._28_4_ = local_240._28_4_;
    local_680 = auVar19._0_4_;
    fStack_67c = auVar19._4_4_;
    fStack_678 = auVar19._8_4_;
    fStack_674 = auVar19._12_4_;
    fStack_670 = auVar19._16_4_;
    fStack_66c = auVar19._20_4_;
    fStack_668 = auVar19._24_4_;
    auVar97 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = auVar276._4_4_ * fVar217;
    auVar41._0_4_ = auVar276._0_4_ * fVar216;
    auVar41._8_4_ = auVar276._8_4_ * fVar218;
    auVar41._12_4_ = auVar276._12_4_ * fVar219;
    auVar41._16_4_ = auVar276._16_4_ * fVar220;
    auVar41._20_4_ = auVar276._20_4_ * fVar221;
    auVar41._24_4_ = auVar276._24_4_ * fVar173;
    auVar41._28_4_ = fVar315;
    auVar42._4_4_ = fVar193 * auVar254._4_4_;
    auVar42._0_4_ = fVar192 * auVar254._0_4_;
    auVar42._8_4_ = fVar194 * auVar254._8_4_;
    auVar42._12_4_ = fVar195 * auVar254._12_4_;
    auVar42._16_4_ = fVar240 * auVar254._16_4_;
    auVar42._20_4_ = fVar300 * auVar254._20_4_;
    auVar42._24_4_ = fVar301 * auVar254._24_4_;
    auVar42._28_4_ = fStack_244;
    auVar127 = vsubps_avx(auVar41,auVar42);
    local_2a0 = auVar254._0_4_ + local_2a0;
    fStack_29c = auVar254._4_4_ + fStack_29c;
    fStack_298 = auVar254._8_4_ + fStack_298;
    fStack_294 = auVar254._12_4_ + fStack_294;
    fStack_290 = auVar254._16_4_ + fStack_290;
    fStack_28c = auVar254._20_4_ + fStack_28c;
    fStack_288 = auVar254._24_4_ + fStack_288;
    fStack_284 = auVar254._28_4_ + auVar25._28_4_;
    local_2c0 = auVar276._0_4_ + local_2c0;
    fStack_2bc = auVar276._4_4_ + fStack_2bc;
    fStack_2b8 = auVar276._8_4_ + fStack_2b8;
    fStack_2b4 = auVar276._12_4_ + fStack_2b4;
    fStack_2b0 = auVar276._16_4_ + fStack_2b0;
    fStack_2ac = auVar276._20_4_ + fStack_2ac;
    fStack_2a8 = auVar276._24_4_ + fStack_2a8;
    fStack_2a4 = auVar276._28_4_ + auVar215._28_4_;
    auVar43._4_4_ = fVar217 * fStack_2bc;
    auVar43._0_4_ = fVar216 * local_2c0;
    auVar43._8_4_ = fVar218 * fStack_2b8;
    auVar43._12_4_ = fVar219 * fStack_2b4;
    auVar43._16_4_ = fVar220 * fStack_2b0;
    auVar43._20_4_ = fVar221 * fStack_2ac;
    auVar43._24_4_ = fVar173 * fStack_2a8;
    auVar43._28_4_ = auVar276._28_4_ + auVar215._28_4_;
    auVar44._4_4_ = fStack_29c * fVar193;
    auVar44._0_4_ = local_2a0 * fVar192;
    auVar44._8_4_ = fStack_298 * fVar194;
    auVar44._12_4_ = fStack_294 * fVar195;
    auVar44._16_4_ = fStack_290 * fVar240;
    auVar44._20_4_ = fStack_28c * fVar300;
    auVar44._24_4_ = fStack_288 * fVar301;
    auVar44._28_4_ = fStack_284;
    auVar25 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = fVar217 * local_200._4_4_;
    auVar45._0_4_ = fVar216 * local_200._0_4_;
    auVar45._8_4_ = fVar218 * local_200._8_4_;
    auVar45._12_4_ = fVar219 * local_200._12_4_;
    auVar45._16_4_ = fVar220 * local_200._16_4_;
    auVar45._20_4_ = fVar221 * local_200._20_4_;
    auVar45._24_4_ = fVar173 * local_200._24_4_;
    auVar45._28_4_ = fStack_284;
    auVar46._4_4_ = fVar193 * fStack_67c;
    auVar46._0_4_ = fVar192 * local_680;
    auVar46._8_4_ = fVar194 * fStack_678;
    auVar46._12_4_ = fVar195 * fStack_674;
    auVar46._16_4_ = fVar240 * fStack_670;
    auVar46._20_4_ = fVar300 * fStack_66c;
    auVar46._24_4_ = fVar301 * fStack_668;
    auVar46._28_4_ = local_200._28_4_;
    auVar128 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = fVar217 * auVar24._4_4_;
    auVar47._0_4_ = fVar216 * auVar24._0_4_;
    auVar47._8_4_ = fVar218 * auVar24._8_4_;
    auVar47._12_4_ = fVar219 * auVar24._12_4_;
    auVar47._16_4_ = fVar220 * auVar24._16_4_;
    auVar47._20_4_ = fVar221 * auVar24._20_4_;
    auVar47._24_4_ = fVar173 * auVar24._24_4_;
    auVar47._28_4_ = auVar27._28_4_ + auVar26._28_4_;
    auVar48._4_4_ = auVar23._4_4_ * fVar193;
    auVar48._0_4_ = auVar23._0_4_ * fVar192;
    auVar48._8_4_ = auVar23._8_4_ * fVar194;
    auVar48._12_4_ = auVar23._12_4_ * fVar195;
    auVar48._16_4_ = auVar23._16_4_ * fVar240;
    auVar48._20_4_ = auVar23._20_4_ * fVar300;
    auVar48._24_4_ = auVar23._24_4_ * fVar301;
    auVar48._28_4_ = auVar28._28_4_ + auVar21._28_4_;
    auVar26 = vsubps_avx(auVar47,auVar48);
    auVar19 = vminps_avx(auVar95,auVar22);
    auVar94 = vmaxps_avx(auVar95,auVar22);
    auVar20 = vminps_avx(auVar96,auVar97);
    auVar20 = vminps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar96,auVar97);
    auVar94 = vmaxps_avx(auVar94,auVar19);
    auVar21 = vminps_avx(auVar127,auVar25);
    auVar19 = vmaxps_avx(auVar127,auVar25);
    auVar22 = vminps_avx(auVar128,auVar26);
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar22 = vminps_avx(auVar20,auVar22);
    auVar20 = vmaxps_avx(auVar128,auVar26);
    auVar19 = vmaxps_avx(auVar19,auVar20);
    auVar19 = vmaxps_avx(auVar94,auVar19);
    auVar94 = vcmpps_avx(auVar22,local_1c0,2);
    auVar19 = vcmpps_avx(auVar19,local_1e0,5);
    auVar94 = vandps_avx(auVar19,auVar94);
    auVar19 = local_2e0 & auVar94;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar19 = vsubps_avx(_local_520,local_220);
      auVar20 = vsubps_avx(auVar23,auVar254);
      fVar217 = auVar19._0_4_ + auVar20._0_4_;
      fVar218 = auVar19._4_4_ + auVar20._4_4_;
      fVar219 = auVar19._8_4_ + auVar20._8_4_;
      fVar220 = auVar19._12_4_ + auVar20._12_4_;
      fVar221 = auVar19._16_4_ + auVar20._16_4_;
      fVar173 = auVar19._20_4_ + auVar20._20_4_;
      fVar192 = auVar19._24_4_ + auVar20._24_4_;
      auVar22 = vsubps_avx(local_240,auVar172);
      auVar25 = vsubps_avx(auVar24,auVar276);
      fVar193 = auVar22._0_4_ + auVar25._0_4_;
      fVar194 = auVar22._4_4_ + auVar25._4_4_;
      fVar195 = auVar22._8_4_ + auVar25._8_4_;
      fVar240 = auVar22._12_4_ + auVar25._12_4_;
      fVar300 = auVar22._16_4_ + auVar25._16_4_;
      fVar301 = auVar22._20_4_ + auVar25._20_4_;
      fVar302 = auVar22._24_4_ + auVar25._24_4_;
      fVar216 = auVar25._28_4_;
      auVar49._4_4_ = auVar172._4_4_ * fVar218;
      auVar49._0_4_ = auVar172._0_4_ * fVar217;
      auVar49._8_4_ = auVar172._8_4_ * fVar219;
      auVar49._12_4_ = auVar172._12_4_ * fVar220;
      auVar49._16_4_ = auVar172._16_4_ * fVar221;
      auVar49._20_4_ = auVar172._20_4_ * fVar173;
      auVar49._24_4_ = auVar172._24_4_ * fVar192;
      auVar49._28_4_ = auVar172._28_4_;
      auVar50._4_4_ = local_220._4_4_ * fVar194;
      auVar50._0_4_ = local_220._0_4_ * fVar193;
      auVar50._8_4_ = local_220._8_4_ * fVar195;
      auVar50._12_4_ = local_220._12_4_ * fVar240;
      auVar50._16_4_ = local_220._16_4_ * fVar300;
      auVar50._20_4_ = local_220._20_4_ * fVar301;
      auVar50._24_4_ = local_220._24_4_ * fVar302;
      auVar50._28_4_ = local_220._28_4_;
      auVar25 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar218 * fStack_27c;
      auVar51._0_4_ = fVar217 * local_280;
      auVar51._8_4_ = fVar219 * fStack_278;
      auVar51._12_4_ = fVar220 * fStack_274;
      auVar51._16_4_ = fVar221 * fStack_270;
      auVar51._20_4_ = fVar173 * fStack_26c;
      auVar51._24_4_ = fVar192 * fStack_268;
      auVar51._28_4_ = auVar172._28_4_;
      auVar52._4_4_ = fVar194 * fStack_25c;
      auVar52._0_4_ = fVar193 * local_260;
      auVar52._8_4_ = fVar195 * fStack_258;
      auVar52._12_4_ = fVar240 * fStack_254;
      auVar52._16_4_ = fVar300 * fStack_250;
      auVar52._20_4_ = fVar301 * fStack_24c;
      auVar52._24_4_ = fVar302 * fStack_248;
      auVar52._28_4_ = fVar216;
      auVar26 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = fVar218 * fStack_69c;
      auVar53._0_4_ = fVar217 * local_6a0;
      auVar53._8_4_ = fVar219 * fStack_698;
      auVar53._12_4_ = fVar220 * fStack_694;
      auVar53._16_4_ = fVar221 * fStack_690;
      auVar53._20_4_ = fVar173 * fStack_68c;
      auVar53._24_4_ = fVar192 * fStack_688;
      auVar53._28_4_ = fVar216;
      auVar54._4_4_ = fVar194 * (float)local_700._4_4_;
      auVar54._0_4_ = fVar193 * (float)local_700._0_4_;
      auVar54._8_4_ = fVar195 * fStack_6f8;
      auVar54._12_4_ = fVar240 * fStack_6f4;
      auVar54._16_4_ = fVar300 * fStack_6f0;
      auVar54._20_4_ = fVar301 * fStack_6ec;
      auVar54._24_4_ = fVar302 * fStack_6e8;
      auVar54._28_4_ = auVar21._28_4_;
      auVar27 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = local_240._4_4_ * fVar218;
      auVar55._0_4_ = local_240._0_4_ * fVar217;
      auVar55._8_4_ = local_240._8_4_ * fVar219;
      auVar55._12_4_ = local_240._12_4_ * fVar220;
      auVar55._16_4_ = local_240._16_4_ * fVar221;
      auVar55._20_4_ = local_240._20_4_ * fVar173;
      auVar55._24_4_ = local_240._24_4_ * fVar192;
      auVar55._28_4_ = auVar21._28_4_;
      auVar56._4_4_ = local_520._4_4_ * fVar194;
      auVar56._0_4_ = local_520._0_4_ * fVar193;
      auVar56._8_4_ = local_520._8_4_ * fVar195;
      auVar56._12_4_ = local_520._12_4_ * fVar240;
      auVar56._16_4_ = local_520._16_4_ * fVar300;
      auVar56._20_4_ = local_520._20_4_ * fVar301;
      uVar6 = local_520._28_4_;
      auVar56._24_4_ = local_520._24_4_ * fVar302;
      auVar56._28_4_ = uVar6;
      auVar28 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = auVar276._4_4_ * fVar218;
      auVar57._0_4_ = auVar276._0_4_ * fVar217;
      auVar57._8_4_ = auVar276._8_4_ * fVar219;
      auVar57._12_4_ = auVar276._12_4_ * fVar220;
      auVar57._16_4_ = auVar276._16_4_ * fVar221;
      auVar57._20_4_ = auVar276._20_4_ * fVar173;
      auVar57._24_4_ = auVar276._24_4_ * fVar192;
      auVar57._28_4_ = uVar6;
      auVar58._4_4_ = auVar254._4_4_ * fVar194;
      auVar58._0_4_ = auVar254._0_4_ * fVar193;
      auVar58._8_4_ = auVar254._8_4_ * fVar195;
      auVar58._12_4_ = auVar254._12_4_ * fVar240;
      auVar58._16_4_ = auVar254._16_4_ * fVar300;
      auVar58._20_4_ = auVar254._20_4_ * fVar301;
      auVar58._24_4_ = auVar254._24_4_ * fVar302;
      auVar58._28_4_ = auVar254._28_4_;
      auVar95 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar218 * fStack_2bc;
      auVar59._0_4_ = fVar217 * local_2c0;
      auVar59._8_4_ = fVar219 * fStack_2b8;
      auVar59._12_4_ = fVar220 * fStack_2b4;
      auVar59._16_4_ = fVar221 * fStack_2b0;
      auVar59._20_4_ = fVar173 * fStack_2ac;
      auVar59._24_4_ = fVar192 * fStack_2a8;
      auVar59._28_4_ = uVar6;
      auVar60._4_4_ = fVar194 * fStack_29c;
      auVar60._0_4_ = fVar193 * local_2a0;
      auVar60._8_4_ = fVar195 * fStack_298;
      auVar60._12_4_ = fVar240 * fStack_294;
      auVar60._16_4_ = fVar300 * fStack_290;
      auVar60._20_4_ = fVar301 * fStack_28c;
      auVar60._24_4_ = fVar302 * fStack_288;
      auVar60._28_4_ = auVar276._28_4_;
      auVar96 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar218 * local_200._4_4_;
      auVar61._0_4_ = fVar217 * local_200._0_4_;
      auVar61._8_4_ = fVar219 * local_200._8_4_;
      auVar61._12_4_ = fVar220 * local_200._12_4_;
      auVar61._16_4_ = fVar221 * local_200._16_4_;
      auVar61._20_4_ = fVar173 * local_200._20_4_;
      auVar61._24_4_ = fVar192 * local_200._24_4_;
      auVar61._28_4_ = auVar276._28_4_;
      auVar62._4_4_ = fStack_67c * fVar194;
      auVar62._0_4_ = local_680 * fVar193;
      auVar62._8_4_ = fStack_678 * fVar195;
      auVar62._12_4_ = fStack_674 * fVar240;
      auVar62._16_4_ = fStack_670 * fVar300;
      auVar62._20_4_ = fStack_66c * fVar301;
      auVar62._24_4_ = fStack_668 * fVar302;
      auVar62._28_4_ = local_240._28_4_;
      auVar97 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = fVar218 * auVar24._4_4_;
      auVar63._0_4_ = fVar217 * auVar24._0_4_;
      auVar63._8_4_ = fVar219 * auVar24._8_4_;
      auVar63._12_4_ = fVar220 * auVar24._12_4_;
      auVar63._16_4_ = fVar221 * auVar24._16_4_;
      auVar63._20_4_ = fVar173 * auVar24._20_4_;
      auVar63._24_4_ = fVar192 * auVar24._24_4_;
      auVar63._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar64._4_4_ = auVar23._4_4_ * fVar194;
      auVar64._0_4_ = auVar23._0_4_ * fVar193;
      auVar64._8_4_ = auVar23._8_4_ * fVar195;
      auVar64._12_4_ = auVar23._12_4_ * fVar240;
      auVar64._16_4_ = auVar23._16_4_ * fVar300;
      auVar64._20_4_ = auVar23._20_4_ * fVar301;
      auVar64._24_4_ = auVar23._24_4_ * fVar302;
      auVar64._28_4_ = auVar22._28_4_ + fVar216;
      auVar24 = vsubps_avx(auVar63,auVar64);
      auVar20 = vminps_avx(auVar25,auVar26);
      auVar19 = vmaxps_avx(auVar25,auVar26);
      auVar21 = vminps_avx(auVar27,auVar28);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar27,auVar28);
      auVar19 = vmaxps_avx(auVar19,auVar20);
      auVar22 = vminps_avx(auVar95,auVar96);
      auVar20 = vmaxps_avx(auVar95,auVar96);
      auVar23 = vminps_avx(auVar97,auVar24);
      auVar22 = vminps_avx(auVar22,auVar23);
      auVar22 = vminps_avx(auVar21,auVar22);
      auVar21 = vmaxps_avx(auVar97,auVar24);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vcmpps_avx(auVar22,local_1c0,2);
      auVar20 = vcmpps_avx(auVar20,local_1e0,5);
      auVar19 = vandps_avx(auVar20,auVar19);
      auVar94 = vandps_avx(local_2e0,auVar94);
      auVar20 = auVar94 & auVar19;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar94 = vandps_avx(auVar19,auVar94);
        uVar70 = vmovmskps_avx(auVar94);
        if (uVar70 != 0) {
          auStack_4a0[uVar75] = uVar70 & 0xff;
          uVar7 = vmovlps_avx(local_440);
          *(undefined8 *)(afStack_360 + uVar75 * 2) = uVar7;
          uVar8 = vmovlps_avx(auVar106);
          auStack_1a0[uVar75] = uVar8;
          uVar75 = (ulong)((int)uVar75 + 1);
        }
      }
    }
LAB_0099caf2:
    do {
      do {
        do {
          do {
            if ((int)uVar75 == 0) {
              uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar105._4_4_ = uVar6;
              auVar105._0_4_ = uVar6;
              auVar105._8_4_ = uVar6;
              auVar105._12_4_ = uVar6;
              auVar105._16_4_ = uVar6;
              auVar105._20_4_ = uVar6;
              auVar105._24_4_ = uVar6;
              auVar105._28_4_ = uVar6;
              auVar94 = vcmpps_avx(local_300,auVar105,2);
              uVar69 = vmovmskps_avx(auVar94);
              uVar69 = (uint)uVar76 & uVar69;
              goto LAB_0099bc49;
            }
            uVar72 = (int)uVar75 - 1;
            uVar73 = (ulong)uVar72;
            uVar70 = auStack_4a0[uVar73];
            fVar216 = afStack_360[uVar73 * 2];
            fVar217 = afStack_360[uVar73 * 2 + 1];
            auVar327._8_8_ = 0;
            auVar327._0_8_ = auStack_1a0[uVar73];
            auVar333 = ZEXT1664(auVar327);
            uVar8 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            auStack_4a0[uVar73] = uVar70;
            if (uVar70 == 0) {
              uVar75 = (ulong)uVar72;
            }
            fVar219 = (float)(uVar8 + 1) * 0.14285715;
            fVar218 = (1.0 - (float)uVar8 * 0.14285715) * fVar216 +
                      fVar217 * (float)uVar8 * 0.14285715;
            fVar216 = (1.0 - fVar219) * fVar216 + fVar217 * fVar219;
            fVar217 = fVar216 - fVar218;
            if (0.16666667 <= fVar217) {
              auVar83 = vinsertps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar216),0x10);
              auVar340 = ZEXT1664(auVar83);
              goto LAB_0099c483;
            }
            auVar83 = vshufps_avx(auVar327,auVar327,0x50);
            auVar110._8_4_ = 0x3f800000;
            auVar110._0_8_ = 0x3f8000003f800000;
            auVar110._12_4_ = 0x3f800000;
            auVar292 = vsubps_avx(auVar110,auVar83);
            fVar219 = auVar83._0_4_;
            fVar220 = auVar83._4_4_;
            fVar221 = auVar83._8_4_;
            fVar173 = auVar83._12_4_;
            fVar192 = auVar292._0_4_;
            fVar193 = auVar292._4_4_;
            fVar194 = auVar292._8_4_;
            fVar195 = auVar292._12_4_;
            auVar139._0_4_ = auVar304._0_4_ * fVar219 + fVar192 * fVar235;
            auVar139._4_4_ = auVar304._4_4_ * fVar220 + fVar193 * fVar237;
            auVar139._8_4_ = auVar304._0_4_ * fVar221 + fVar194 * fVar235;
            auVar139._12_4_ = auVar304._4_4_ * fVar173 + fVar195 * fVar237;
            auVar178._0_4_ = auVar258._0_4_ * fVar219 + fVar192 * fVar236;
            auVar178._4_4_ = auVar258._4_4_ * fVar220 + fVar193 * fVar239;
            auVar178._8_4_ = auVar258._0_4_ * fVar221 + fVar194 * fVar236;
            auVar178._12_4_ = auVar258._4_4_ * fVar173 + fVar195 * fVar239;
            auVar205._0_4_ = auVar109._0_4_ * fVar219 + auVar325._0_4_ * fVar192;
            auVar205._4_4_ = auVar109._4_4_ * fVar220 + auVar325._4_4_ * fVar193;
            auVar205._8_4_ = auVar109._0_4_ * fVar221 + auVar325._0_4_ * fVar194;
            auVar205._12_4_ = auVar109._4_4_ * fVar173 + auVar325._4_4_ * fVar195;
            auVar80._0_4_ = auVar78._0_4_ * fVar219 + auVar317._0_4_ * fVar192;
            auVar80._4_4_ = auVar78._4_4_ * fVar220 + auVar317._4_4_ * fVar193;
            auVar80._8_4_ = auVar78._0_4_ * fVar221 + auVar317._0_4_ * fVar194;
            auVar80._12_4_ = auVar78._4_4_ * fVar173 + auVar317._4_4_ * fVar195;
            auVar132._16_16_ = auVar139;
            auVar132._0_16_ = auVar139;
            auVar158._16_16_ = auVar178;
            auVar158._0_16_ = auVar178;
            auVar191._16_16_ = auVar205;
            auVar191._0_16_ = auVar205;
            auVar94 = ZEXT2032(CONCAT416(fVar216,ZEXT416((uint)fVar218)));
            auVar94 = vshufps_avx(auVar94,auVar94,0);
            auVar19 = vsubps_avx(auVar158,auVar132);
            fVar219 = auVar94._0_4_;
            fVar220 = auVar94._4_4_;
            fVar221 = auVar94._8_4_;
            fVar173 = auVar94._12_4_;
            fVar192 = auVar94._16_4_;
            fVar193 = auVar94._20_4_;
            fVar194 = auVar94._24_4_;
            auVar133._0_4_ = auVar139._0_4_ + auVar19._0_4_ * fVar219;
            auVar133._4_4_ = auVar139._4_4_ + auVar19._4_4_ * fVar220;
            auVar133._8_4_ = auVar139._8_4_ + auVar19._8_4_ * fVar221;
            auVar133._12_4_ = auVar139._12_4_ + auVar19._12_4_ * fVar173;
            auVar133._16_4_ = auVar139._0_4_ + auVar19._16_4_ * fVar192;
            auVar133._20_4_ = auVar139._4_4_ + auVar19._20_4_ * fVar193;
            auVar133._24_4_ = auVar139._8_4_ + auVar19._24_4_ * fVar194;
            auVar133._28_4_ = auVar139._12_4_ + auVar19._28_4_;
            auVar94 = vsubps_avx(auVar191,auVar158);
            auVar159._0_4_ = auVar178._0_4_ + auVar94._0_4_ * fVar219;
            auVar159._4_4_ = auVar178._4_4_ + auVar94._4_4_ * fVar220;
            auVar159._8_4_ = auVar178._8_4_ + auVar94._8_4_ * fVar221;
            auVar159._12_4_ = auVar178._12_4_ + auVar94._12_4_ * fVar173;
            auVar159._16_4_ = auVar178._0_4_ + auVar94._16_4_ * fVar192;
            auVar159._20_4_ = auVar178._4_4_ + auVar94._20_4_ * fVar193;
            auVar159._24_4_ = auVar178._8_4_ + auVar94._24_4_ * fVar194;
            auVar159._28_4_ = auVar178._12_4_ + auVar94._28_4_;
            auVar83 = vsubps_avx(auVar80,auVar205);
            auVar101._0_4_ = auVar205._0_4_ + auVar83._0_4_ * fVar219;
            auVar101._4_4_ = auVar205._4_4_ + auVar83._4_4_ * fVar220;
            auVar101._8_4_ = auVar205._8_4_ + auVar83._8_4_ * fVar221;
            auVar101._12_4_ = auVar205._12_4_ + auVar83._12_4_ * fVar173;
            auVar101._16_4_ = auVar205._0_4_ + auVar83._0_4_ * fVar192;
            auVar101._20_4_ = auVar205._4_4_ + auVar83._4_4_ * fVar193;
            auVar101._24_4_ = auVar205._8_4_ + auVar83._8_4_ * fVar194;
            auVar101._28_4_ = auVar205._12_4_ + auVar83._12_4_;
            auVar94 = vsubps_avx(auVar159,auVar133);
            auVar134._0_4_ = auVar133._0_4_ + fVar219 * auVar94._0_4_;
            auVar134._4_4_ = auVar133._4_4_ + fVar220 * auVar94._4_4_;
            auVar134._8_4_ = auVar133._8_4_ + fVar221 * auVar94._8_4_;
            auVar134._12_4_ = auVar133._12_4_ + fVar173 * auVar94._12_4_;
            auVar134._16_4_ = auVar133._16_4_ + fVar192 * auVar94._16_4_;
            auVar134._20_4_ = auVar133._20_4_ + fVar193 * auVar94._20_4_;
            auVar134._24_4_ = auVar133._24_4_ + fVar194 * auVar94._24_4_;
            auVar134._28_4_ = auVar133._28_4_ + auVar94._28_4_;
            auVar94 = vsubps_avx(auVar101,auVar159);
            auVar102._0_4_ = auVar159._0_4_ + fVar219 * auVar94._0_4_;
            auVar102._4_4_ = auVar159._4_4_ + fVar220 * auVar94._4_4_;
            auVar102._8_4_ = auVar159._8_4_ + fVar221 * auVar94._8_4_;
            auVar102._12_4_ = auVar159._12_4_ + fVar173 * auVar94._12_4_;
            auVar102._16_4_ = auVar159._16_4_ + fVar192 * auVar94._16_4_;
            auVar102._20_4_ = auVar159._20_4_ + fVar193 * auVar94._20_4_;
            auVar102._24_4_ = auVar159._24_4_ + fVar194 * auVar94._24_4_;
            auVar102._28_4_ = auVar159._28_4_ + auVar94._28_4_;
            auVar94 = vsubps_avx(auVar102,auVar134);
            auVar229._0_4_ = auVar134._0_4_ + fVar219 * auVar94._0_4_;
            auVar229._4_4_ = auVar134._4_4_ + fVar220 * auVar94._4_4_;
            auVar229._8_4_ = auVar134._8_4_ + fVar221 * auVar94._8_4_;
            auVar229._12_4_ = auVar134._12_4_ + fVar173 * auVar94._12_4_;
            auVar233._16_4_ = auVar134._16_4_ + fVar192 * auVar94._16_4_;
            auVar233._0_16_ = auVar229;
            auVar233._20_4_ = auVar134._20_4_ + fVar193 * auVar94._20_4_;
            auVar233._24_4_ = auVar134._24_4_ + fVar194 * auVar94._24_4_;
            auVar233._28_4_ = auVar134._28_4_ + auVar159._28_4_;
            auVar238 = auVar233._16_16_;
            auVar112 = vshufps_avx(ZEXT416((uint)(fVar217 * 0.33333334)),
                                   ZEXT416((uint)(fVar217 * 0.33333334)),0);
            auVar179._0_4_ = auVar229._0_4_ + auVar112._0_4_ * auVar94._0_4_ * 3.0;
            auVar179._4_4_ = auVar229._4_4_ + auVar112._4_4_ * auVar94._4_4_ * 3.0;
            auVar179._8_4_ = auVar229._8_4_ + auVar112._8_4_ * auVar94._8_4_ * 3.0;
            auVar179._12_4_ = auVar229._12_4_ + auVar112._12_4_ * auVar94._12_4_ * 3.0;
            auVar155 = vshufpd_avx(auVar229,auVar229,3);
            auVar124 = vshufpd_avx(auVar238,auVar238,3);
            _local_520 = auVar155;
            auVar83 = vsubps_avx(auVar155,auVar229);
            auVar292 = vsubps_avx(auVar124,auVar238);
            auVar81._0_4_ = auVar83._0_4_ + auVar292._0_4_;
            auVar81._4_4_ = auVar83._4_4_ + auVar292._4_4_;
            auVar81._8_4_ = auVar83._8_4_ + auVar292._8_4_;
            auVar81._12_4_ = auVar83._12_4_ + auVar292._12_4_;
            auVar83 = vmovshdup_avx(auVar229);
            auVar292 = vmovshdup_avx(auVar179);
            auVar141 = vshufps_avx(auVar81,auVar81,0);
            auVar113 = vshufps_avx(auVar81,auVar81,0x55);
            fVar219 = auVar113._0_4_;
            fVar220 = auVar113._4_4_;
            fVar221 = auVar113._8_4_;
            fVar173 = auVar113._12_4_;
            fVar192 = auVar141._0_4_;
            fVar193 = auVar141._4_4_;
            fVar194 = auVar141._8_4_;
            fVar195 = auVar141._12_4_;
            auVar82._0_4_ = fVar192 * auVar229._0_4_ + auVar83._0_4_ * fVar219;
            auVar82._4_4_ = fVar193 * auVar229._4_4_ + auVar83._4_4_ * fVar220;
            auVar82._8_4_ = fVar194 * auVar229._8_4_ + auVar83._8_4_ * fVar221;
            auVar82._12_4_ = fVar195 * auVar229._12_4_ + auVar83._12_4_ * fVar173;
            auVar293._0_4_ = fVar192 * auVar179._0_4_ + auVar292._0_4_ * fVar219;
            auVar293._4_4_ = fVar193 * auVar179._4_4_ + auVar292._4_4_ * fVar220;
            auVar293._8_4_ = fVar194 * auVar179._8_4_ + auVar292._8_4_ * fVar221;
            auVar293._12_4_ = fVar195 * auVar179._12_4_ + auVar292._12_4_ * fVar173;
            auVar292 = vshufps_avx(auVar82,auVar82,0xe8);
            auVar141 = vshufps_avx(auVar293,auVar293,0xe8);
            auVar83 = vcmpps_avx(auVar292,auVar141,1);
            uVar70 = vextractps_avx(auVar83,0);
            auVar113 = auVar293;
            if ((uVar70 & 1) == 0) {
              auVar113 = auVar82;
            }
            auVar111._0_4_ = auVar112._0_4_ * auVar94._16_4_ * 3.0;
            auVar111._4_4_ = auVar112._4_4_ * auVar94._20_4_ * 3.0;
            auVar111._8_4_ = auVar112._8_4_ * auVar94._24_4_ * 3.0;
            auVar111._12_4_ = auVar112._12_4_ * 0.0;
            auVar77 = vsubps_avx(auVar238,auVar111);
            auVar112 = vmovshdup_avx(auVar77);
            auVar238 = vmovshdup_avx(auVar238);
            fVar240 = auVar77._0_4_;
            fVar300 = auVar77._4_4_;
            auVar206._0_4_ = fVar240 * fVar192 + auVar112._0_4_ * fVar219;
            auVar206._4_4_ = fVar300 * fVar193 + auVar112._4_4_ * fVar220;
            auVar206._8_4_ = auVar77._8_4_ * fVar194 + auVar112._8_4_ * fVar221;
            auVar206._12_4_ = auVar77._12_4_ * fVar195 + auVar112._12_4_ * fVar173;
            auVar338._0_4_ = fVar192 * auVar233._16_4_ + auVar238._0_4_ * fVar219;
            auVar338._4_4_ = fVar193 * auVar233._20_4_ + auVar238._4_4_ * fVar220;
            auVar338._8_4_ = fVar194 * auVar233._24_4_ + auVar238._8_4_ * fVar221;
            auVar338._12_4_ = fVar195 * auVar233._28_4_ + auVar238._12_4_ * fVar173;
            auVar238 = vshufps_avx(auVar206,auVar206,0xe8);
            auVar268 = vshufps_avx(auVar338,auVar338,0xe8);
            auVar112 = vcmpps_avx(auVar238,auVar268,1);
            uVar70 = vextractps_avx(auVar112,0);
            auVar106 = auVar338;
            if ((uVar70 & 1) == 0) {
              auVar106 = auVar206;
            }
            auVar113 = vmaxss_avx(auVar106,auVar113);
            auVar292 = vminps_avx(auVar292,auVar141);
            auVar141 = vminps_avx(auVar238,auVar268);
            auVar141 = vminps_avx(auVar292,auVar141);
            auVar83 = vshufps_avx(auVar83,auVar83,0x55);
            auVar83 = vblendps_avx(auVar83,auVar112,2);
            auVar112 = vpslld_avx(auVar83,0x1f);
            auVar83 = vshufpd_avx(auVar293,auVar293,1);
            auVar83 = vinsertps_avx(auVar83,auVar338,0x9c);
            auVar292 = vshufpd_avx(auVar82,auVar82,1);
            auVar292 = vinsertps_avx(auVar292,auVar206,0x9c);
            auVar83 = vblendvps_avx(auVar292,auVar83,auVar112);
            auVar292 = vmovshdup_avx(auVar83);
            auVar83 = vmaxss_avx(auVar292,auVar83);
            fVar221 = auVar141._0_4_;
            auVar292 = vmovshdup_avx(auVar141);
            fVar220 = auVar83._0_4_;
            fVar173 = auVar292._0_4_;
            fVar219 = auVar113._0_4_;
            if ((fVar221 < 0.0001) && (-0.0001 < fVar220)) break;
            if ((fVar173 < 0.0001 && -0.0001 < fVar219) || (fVar221 < 0.0001 && -0.0001 < fVar219))
            break;
            auVar112 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar83,1);
            auVar292 = vcmpps_avx(auVar292,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar292 = vandps_avx(auVar292,auVar112);
          } while ((auVar292 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar112 = vcmpps_avx(auVar141,_DAT_01f45a50,1);
          auVar292 = vcmpss_avx(auVar113,ZEXT416(0) << 0x20,1);
          auVar140._8_4_ = 0x3f800000;
          auVar140._0_8_ = 0x3f8000003f800000;
          auVar140._12_4_ = 0x3f800000;
          auVar180._8_4_ = 0xbf800000;
          auVar180._0_8_ = 0xbf800000bf800000;
          auVar180._12_4_ = 0xbf800000;
          auVar292 = vblendvps_avx(auVar140,auVar180,auVar292);
          auVar112 = vblendvps_avx(auVar140,auVar180,auVar112);
          auVar141 = vcmpss_avx(auVar112,auVar292,4);
          auVar141 = vpshufd_avx(ZEXT416(auVar141._0_4_ & 1),0x50);
          auVar141 = vpslld_avx(auVar141,0x1f);
          auVar141 = vpsrad_avx(auVar141,0x1f);
          auVar141 = vpandn_avx(auVar141,_DAT_01f7afb0);
          auVar113 = vmovshdup_avx(auVar112);
          fVar192 = auVar113._0_4_;
          if ((auVar112._0_4_ != fVar192) || (NAN(auVar112._0_4_) || NAN(fVar192))) {
            if ((fVar173 != fVar221) || (NAN(fVar173) || NAN(fVar221))) {
              fVar221 = -fVar221 / (fVar173 - fVar221);
              auVar112 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar221) * 0.0 + fVar221)));
            }
            else {
              auVar112 = ZEXT816(0x3f80000000000000);
              if ((fVar221 != 0.0) || (NAN(fVar221))) {
                auVar112 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar238 = vcmpps_avx(auVar141,auVar112,1);
            auVar113 = vblendps_avx(auVar141,auVar112,2);
            auVar112 = vblendps_avx(auVar112,auVar141,2);
            auVar141 = vblendvps_avx(auVar112,auVar113,auVar238);
          }
          auVar83 = vcmpss_avx(auVar83,ZEXT416(0) << 0x20,1);
          auVar142._8_4_ = 0x3f800000;
          auVar142._0_8_ = 0x3f8000003f800000;
          auVar142._12_4_ = 0x3f800000;
          auVar181._8_4_ = 0xbf800000;
          auVar181._0_8_ = 0xbf800000bf800000;
          auVar181._12_4_ = 0xbf800000;
          auVar83 = vblendvps_avx(auVar142,auVar181,auVar83);
          fVar221 = auVar83._0_4_;
          if ((auVar292._0_4_ != fVar221) || (NAN(auVar292._0_4_) || NAN(fVar221))) {
            if ((fVar220 != fVar219) || (NAN(fVar220) || NAN(fVar219))) {
              fVar219 = -fVar219 / (fVar220 - fVar219);
              auVar83 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar219) * 0.0 + fVar219)));
            }
            else {
              auVar83 = ZEXT816(0x3f80000000000000);
              if ((fVar219 != 0.0) || (NAN(fVar219))) {
                auVar83 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar112 = vcmpps_avx(auVar141,auVar83,1);
            auVar292 = vblendps_avx(auVar141,auVar83,2);
            auVar83 = vblendps_avx(auVar83,auVar141,2);
            auVar141 = vblendvps_avx(auVar83,auVar292,auVar112);
          }
          if ((fVar192 != fVar221) || (NAN(fVar192) || NAN(fVar221))) {
            auVar84._8_4_ = 0x3f800000;
            auVar84._0_8_ = 0x3f8000003f800000;
            auVar84._12_4_ = 0x3f800000;
            auVar83 = vcmpps_avx(auVar141,auVar84,1);
            auVar292 = vinsertps_avx(auVar141,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar143._4_12_ = auVar141._4_12_;
            auVar143._0_4_ = 0x3f800000;
            auVar141 = vblendvps_avx(auVar143,auVar292,auVar83);
          }
          auVar83 = vcmpps_avx(auVar141,_DAT_01f46740,1);
          auVar66._12_4_ = 0;
          auVar66._0_12_ = auVar141._4_12_;
          auVar292 = vinsertps_avx(auVar141,ZEXT416(0x3f800000),0x10);
          auVar83 = vblendvps_avx(auVar292,auVar66 << 0x20,auVar83);
          auVar292 = vmovshdup_avx(auVar83);
        } while (auVar292._0_4_ < auVar83._0_4_);
        auVar85._0_4_ = auVar83._0_4_ + -0.1;
        auVar85._4_4_ = auVar83._4_4_ + 0.1;
        auVar85._8_4_ = auVar83._8_4_ + 0.0;
        auVar85._12_4_ = auVar83._12_4_ + 0.0;
        auVar112 = vshufpd_avx(auVar179,auVar179,3);
        auVar230._8_8_ = 0x3f80000000000000;
        auVar230._0_8_ = 0x3f80000000000000;
        auVar83 = vcmpps_avx(auVar85,auVar230,1);
        auVar65._12_4_ = 0;
        auVar65._0_12_ = auVar85._4_12_;
        auVar292 = vinsertps_avx(auVar85,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar83 = vblendvps_avx(auVar292,auVar65 << 0x20,auVar83);
        auVar292 = vshufpd_avx(auVar77,auVar77,3);
        auVar141 = vshufps_avx(auVar83,auVar83,0x50);
        auVar328._8_4_ = 0x3f800000;
        auVar328._0_8_ = 0x3f8000003f800000;
        auVar328._12_4_ = 0x3f800000;
        auVar113 = vsubps_avx(auVar328,auVar141);
        local_520._0_4_ = auVar155._0_4_;
        local_520._4_4_ = auVar155._4_4_;
        fStack_518 = auVar155._8_4_;
        fStack_514 = auVar155._12_4_;
        fVar219 = auVar141._0_4_;
        fVar220 = auVar141._4_4_;
        fVar221 = auVar141._8_4_;
        fVar173 = auVar141._12_4_;
        local_6c0 = auVar124._0_4_;
        fStack_6bc = auVar124._4_4_;
        fStack_6b8 = auVar124._8_4_;
        fStack_6b4 = auVar124._12_4_;
        fVar192 = auVar113._0_4_;
        fVar193 = auVar113._4_4_;
        fVar194 = auVar113._8_4_;
        fVar195 = auVar113._12_4_;
        auVar86._0_4_ = fVar219 * (float)local_520._0_4_ + fVar192 * auVar229._0_4_;
        auVar86._4_4_ = fVar220 * (float)local_520._4_4_ + fVar193 * auVar229._4_4_;
        auVar86._8_4_ = fVar221 * fStack_518 + fVar194 * auVar229._0_4_;
        auVar86._12_4_ = fVar173 * fStack_514 + fVar195 * auVar229._4_4_;
        auVar207._0_4_ = auVar112._0_4_ * fVar219 + fVar192 * auVar179._0_4_;
        auVar207._4_4_ = auVar112._4_4_ * fVar220 + fVar193 * auVar179._4_4_;
        auVar207._8_4_ = auVar112._8_4_ * fVar221 + fVar194 * auVar179._0_4_;
        auVar207._12_4_ = auVar112._12_4_ * fVar173 + fVar195 * auVar179._4_4_;
        auVar247._0_4_ = auVar292._0_4_ * fVar219 + fVar192 * fVar240;
        auVar247._4_4_ = auVar292._4_4_ * fVar220 + fVar193 * fVar300;
        auVar247._8_4_ = auVar292._8_4_ * fVar221 + fVar194 * fVar240;
        auVar247._12_4_ = auVar292._12_4_ * fVar173 + fVar195 * fVar300;
        auVar284._0_4_ = fVar219 * local_6c0 + fVar192 * auVar233._16_4_;
        auVar284._4_4_ = fVar220 * fStack_6bc + fVar193 * auVar233._20_4_;
        auVar284._8_4_ = fVar221 * fStack_6b8 + fVar194 * auVar233._16_4_;
        auVar284._12_4_ = fVar173 * fStack_6b4 + fVar195 * auVar233._20_4_;
        auVar124 = vsubps_avx(auVar328,auVar83);
        auVar292 = vmovshdup_avx(auVar327);
        auVar155 = vmovsldup_avx(auVar327);
        auVar339._0_4_ = auVar124._0_4_ * auVar155._0_4_ + auVar83._0_4_ * auVar292._0_4_;
        auVar339._4_4_ = auVar124._4_4_ * auVar155._4_4_ + auVar83._4_4_ * auVar292._4_4_;
        auVar339._8_4_ = auVar124._8_4_ * auVar155._8_4_ + auVar83._8_4_ * auVar292._8_4_;
        auVar339._12_4_ = auVar124._12_4_ * auVar155._12_4_ + auVar83._12_4_ * auVar292._12_4_;
        auVar77 = vmovshdup_avx(auVar339);
        auVar83 = vsubps_avx(auVar207,auVar86);
        auVar144._0_4_ = auVar83._0_4_ * 3.0;
        auVar144._4_4_ = auVar83._4_4_ * 3.0;
        auVar144._8_4_ = auVar83._8_4_ * 3.0;
        auVar144._12_4_ = auVar83._12_4_ * 3.0;
        auVar83 = vsubps_avx(auVar247,auVar207);
        auVar165._0_4_ = auVar83._0_4_ * 3.0;
        auVar165._4_4_ = auVar83._4_4_ * 3.0;
        auVar165._8_4_ = auVar83._8_4_ * 3.0;
        auVar165._12_4_ = auVar83._12_4_ * 3.0;
        auVar83 = vsubps_avx(auVar284,auVar247);
        auVar259._0_4_ = auVar83._0_4_ * 3.0;
        auVar259._4_4_ = auVar83._4_4_ * 3.0;
        auVar259._8_4_ = auVar83._8_4_ * 3.0;
        auVar259._12_4_ = auVar83._12_4_ * 3.0;
        auVar292 = vminps_avx(auVar165,auVar259);
        auVar83 = vmaxps_avx(auVar165,auVar259);
        auVar292 = vminps_avx(auVar144,auVar292);
        auVar83 = vmaxps_avx(auVar144,auVar83);
        auVar155 = vshufpd_avx(auVar292,auVar292,3);
        auVar124 = vshufpd_avx(auVar83,auVar83,3);
        auVar292 = vminps_avx(auVar292,auVar155);
        auVar83 = vmaxps_avx(auVar83,auVar124);
        auVar155 = vshufps_avx(ZEXT416((uint)(1.0 / fVar217)),ZEXT416((uint)(1.0 / fVar217)),0);
        auVar260._0_4_ = auVar155._0_4_ * auVar292._0_4_;
        auVar260._4_4_ = auVar155._4_4_ * auVar292._4_4_;
        auVar260._8_4_ = auVar155._8_4_ * auVar292._8_4_;
        auVar260._12_4_ = auVar155._12_4_ * auVar292._12_4_;
        auVar270._0_4_ = auVar155._0_4_ * auVar83._0_4_;
        auVar270._4_4_ = auVar155._4_4_ * auVar83._4_4_;
        auVar270._8_4_ = auVar155._8_4_ * auVar83._8_4_;
        auVar270._12_4_ = auVar155._12_4_ * auVar83._12_4_;
        auVar113 = ZEXT416((uint)(1.0 / (auVar77._0_4_ - auVar339._0_4_)));
        auVar83 = vshufpd_avx(auVar86,auVar86,3);
        auVar292 = vshufpd_avx(auVar207,auVar207,3);
        auVar155 = vshufpd_avx(auVar247,auVar247,3);
        auVar124 = vshufpd_avx(auVar284,auVar284,3);
        auVar83 = vsubps_avx(auVar83,auVar86);
        auVar112 = vsubps_avx(auVar292,auVar207);
        auVar141 = vsubps_avx(auVar155,auVar247);
        auVar124 = vsubps_avx(auVar124,auVar284);
        auVar292 = vminps_avx(auVar83,auVar112);
        auVar83 = vmaxps_avx(auVar83,auVar112);
        auVar155 = vminps_avx(auVar141,auVar124);
        auVar155 = vminps_avx(auVar292,auVar155);
        auVar292 = vmaxps_avx(auVar141,auVar124);
        auVar83 = vmaxps_avx(auVar83,auVar292);
        auVar292 = vshufps_avx(auVar113,auVar113,0);
        auVar318._0_4_ = auVar292._0_4_ * auVar155._0_4_;
        auVar318._4_4_ = auVar292._4_4_ * auVar155._4_4_;
        auVar318._8_4_ = auVar292._8_4_ * auVar155._8_4_;
        auVar318._12_4_ = auVar292._12_4_ * auVar155._12_4_;
        auVar329._0_4_ = auVar292._0_4_ * auVar83._0_4_;
        auVar329._4_4_ = auVar292._4_4_ * auVar83._4_4_;
        auVar329._8_4_ = auVar292._8_4_ * auVar83._8_4_;
        auVar329._12_4_ = auVar292._12_4_ * auVar83._12_4_;
        auVar83 = vmovsldup_avx(auVar339);
        auVar285._4_12_ = auVar83._4_12_;
        auVar285._0_4_ = fVar218;
        auVar294._4_12_ = auVar339._4_12_;
        auVar294._0_4_ = fVar216;
        auVar166._0_4_ = (fVar218 + fVar216) * 0.5;
        auVar166._4_4_ = (auVar83._4_4_ + auVar339._4_4_) * 0.5;
        auVar166._8_4_ = (auVar83._8_4_ + auVar339._8_4_) * 0.5;
        auVar166._12_4_ = (auVar83._12_4_ + auVar339._12_4_) * 0.5;
        auVar83 = vshufps_avx(auVar166,auVar166,0);
        fVar219 = auVar83._0_4_;
        fVar220 = auVar83._4_4_;
        fVar221 = auVar83._8_4_;
        fVar173 = auVar83._12_4_;
        local_6d0._0_4_ = auVar9._0_4_;
        local_6d0._4_4_ = auVar9._4_4_;
        fStack_6c8 = auVar9._8_4_;
        fStack_6c4 = auVar9._12_4_;
        auVar114._0_4_ = fVar219 * (float)local_370._0_4_ + (float)local_6d0._0_4_;
        auVar114._4_4_ = fVar220 * (float)local_370._4_4_ + (float)local_6d0._4_4_;
        auVar114._8_4_ = fVar221 * fStack_368 + fStack_6c8;
        auVar114._12_4_ = fVar173 * fStack_364 + fStack_6c4;
        local_5b0 = auVar10._0_4_;
        fStack_5ac = auVar10._4_4_;
        fStack_5a8 = auVar10._8_4_;
        fStack_5a4 = auVar10._12_4_;
        auVar145._0_4_ = fVar219 * (float)local_380._0_4_ + local_5b0;
        auVar145._4_4_ = fVar220 * (float)local_380._4_4_ + fStack_5ac;
        auVar145._8_4_ = fVar221 * fStack_378 + fStack_5a8;
        auVar145._12_4_ = fVar173 * fStack_374 + fStack_5a4;
        local_5c0 = auVar11._0_4_;
        fStack_5bc = auVar11._4_4_;
        fStack_5b8 = auVar11._8_4_;
        fStack_5b4 = auVar11._12_4_;
        auVar208._0_4_ = fVar219 * (float)local_390._0_4_ + local_5c0;
        auVar208._4_4_ = fVar220 * (float)local_390._4_4_ + fStack_5bc;
        auVar208._8_4_ = fVar221 * fStack_388 + fStack_5b8;
        auVar208._12_4_ = fVar173 * fStack_384 + fStack_5b4;
        auVar83 = vsubps_avx(auVar145,auVar114);
        auVar115._0_4_ = auVar114._0_4_ + fVar219 * auVar83._0_4_;
        auVar115._4_4_ = auVar114._4_4_ + fVar220 * auVar83._4_4_;
        auVar115._8_4_ = auVar114._8_4_ + fVar221 * auVar83._8_4_;
        auVar115._12_4_ = auVar114._12_4_ + fVar173 * auVar83._12_4_;
        auVar83 = vsubps_avx(auVar208,auVar145);
        auVar146._0_4_ = auVar145._0_4_ + fVar219 * auVar83._0_4_;
        auVar146._4_4_ = auVar145._4_4_ + fVar220 * auVar83._4_4_;
        auVar146._8_4_ = auVar145._8_4_ + fVar221 * auVar83._8_4_;
        auVar146._12_4_ = auVar145._12_4_ + fVar173 * auVar83._12_4_;
        auVar83 = vsubps_avx(auVar146,auVar115);
        fVar219 = auVar115._0_4_ + fVar219 * auVar83._0_4_;
        fVar220 = auVar115._4_4_ + fVar220 * auVar83._4_4_;
        auVar87._0_8_ = CONCAT44(fVar220,fVar219);
        auVar87._8_4_ = auVar115._8_4_ + fVar221 * auVar83._8_4_;
        auVar87._12_4_ = auVar115._12_4_ + fVar173 * auVar83._12_4_;
        fVar221 = auVar83._0_4_ * 3.0;
        fVar173 = auVar83._4_4_ * 3.0;
        auVar116._0_8_ = CONCAT44(fVar173,fVar221);
        auVar116._8_4_ = auVar83._8_4_ * 3.0;
        auVar116._12_4_ = auVar83._12_4_ * 3.0;
        auVar147._8_8_ = auVar87._0_8_;
        auVar147._0_8_ = auVar87._0_8_;
        auVar83 = vshufpd_avx(auVar87,auVar87,3);
        auVar292 = vshufps_avx(auVar166,auVar166,0x55);
        auVar141 = vsubps_avx(auVar83,auVar147);
        auVar305._0_4_ = auVar141._0_4_ * auVar292._0_4_ + fVar219;
        auVar305._4_4_ = auVar141._4_4_ * auVar292._4_4_ + fVar220;
        auVar305._8_4_ = auVar141._8_4_ * auVar292._8_4_ + fVar219;
        auVar305._12_4_ = auVar141._12_4_ * auVar292._12_4_ + fVar220;
        auVar148._8_8_ = auVar116._0_8_;
        auVar148._0_8_ = auVar116._0_8_;
        auVar83 = vshufpd_avx(auVar116,auVar116,1);
        auVar83 = vsubps_avx(auVar83,auVar148);
        auVar117._0_4_ = auVar83._0_4_ * auVar292._0_4_ + fVar221;
        auVar117._4_4_ = auVar83._4_4_ * auVar292._4_4_ + fVar173;
        auVar117._8_4_ = auVar83._8_4_ * auVar292._8_4_ + fVar221;
        auVar117._12_4_ = auVar83._12_4_ * auVar292._12_4_ + fVar173;
        auVar292 = vmovshdup_avx(auVar117);
        auVar209._0_8_ = auVar292._0_8_ ^ 0x8000000080000000;
        auVar209._8_4_ = auVar292._8_4_ ^ 0x80000000;
        auVar209._12_4_ = auVar292._12_4_ ^ 0x80000000;
        auVar155 = vmovshdup_avx(auVar141);
        auVar83 = vunpcklps_avx(auVar155,auVar209);
        auVar124 = vshufps_avx(auVar83,auVar209,4);
        auVar88._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
        auVar88._8_4_ = -auVar141._8_4_;
        auVar88._12_4_ = -auVar141._12_4_;
        auVar83 = vmovlhps_avx(auVar88,auVar117);
        auVar112 = vshufps_avx(auVar83,auVar117,8);
        auVar83 = ZEXT416((uint)(auVar117._0_4_ * auVar155._0_4_ - auVar141._0_4_ * auVar292._0_4_))
        ;
        auVar292 = vshufps_avx(auVar83,auVar83,0);
        auVar83 = vdivps_avx(auVar124,auVar292);
        auVar292 = vdivps_avx(auVar112,auVar292);
        auVar112 = vinsertps_avx(auVar260,auVar318,0x1c);
        auVar141 = vinsertps_avx(auVar270,auVar329,0x1c);
        auVar113 = vinsertps_avx(auVar318,auVar260,0x4c);
        auVar238 = vinsertps_avx(auVar329,auVar270,0x4c);
        auVar155 = vmovsldup_avx(auVar83);
        auVar149._0_4_ = auVar155._0_4_ * auVar112._0_4_;
        auVar149._4_4_ = auVar155._4_4_ * auVar112._4_4_;
        auVar149._8_4_ = auVar155._8_4_ * auVar112._8_4_;
        auVar149._12_4_ = auVar155._12_4_ * auVar112._12_4_;
        auVar118._0_4_ = auVar141._0_4_ * auVar155._0_4_;
        auVar118._4_4_ = auVar141._4_4_ * auVar155._4_4_;
        auVar118._8_4_ = auVar141._8_4_ * auVar155._8_4_;
        auVar118._12_4_ = auVar141._12_4_ * auVar155._12_4_;
        auVar124 = vminps_avx(auVar149,auVar118);
        auVar155 = vmaxps_avx(auVar118,auVar149);
        auVar268 = vmovsldup_avx(auVar292);
        auVar330._0_4_ = auVar113._0_4_ * auVar268._0_4_;
        auVar330._4_4_ = auVar113._4_4_ * auVar268._4_4_;
        auVar330._8_4_ = auVar113._8_4_ * auVar268._8_4_;
        auVar330._12_4_ = auVar113._12_4_ * auVar268._12_4_;
        auVar150._0_4_ = auVar238._0_4_ * auVar268._0_4_;
        auVar150._4_4_ = auVar238._4_4_ * auVar268._4_4_;
        auVar150._8_4_ = auVar238._8_4_ * auVar268._8_4_;
        auVar150._12_4_ = auVar238._12_4_ * auVar268._12_4_;
        auVar268 = vminps_avx(auVar330,auVar150);
        auVar182._0_4_ = auVar124._0_4_ + auVar268._0_4_;
        auVar182._4_4_ = auVar124._4_4_ + auVar268._4_4_;
        auVar182._8_4_ = auVar124._8_4_ + auVar268._8_4_;
        auVar182._12_4_ = auVar124._12_4_ + auVar268._12_4_;
        auVar124 = vmaxps_avx(auVar150,auVar330);
        auVar268 = vsubps_avx(auVar285,auVar166);
        auVar106 = vsubps_avx(auVar294,auVar166);
        auVar119._0_4_ = auVar155._0_4_ + auVar124._0_4_;
        auVar119._4_4_ = auVar155._4_4_ + auVar124._4_4_;
        auVar119._8_4_ = auVar155._8_4_ + auVar124._8_4_;
        auVar119._12_4_ = auVar155._12_4_ + auVar124._12_4_;
        auVar151._8_8_ = 0x3f800000;
        auVar151._0_8_ = 0x3f800000;
        auVar155 = vsubps_avx(auVar151,auVar119);
        auVar124 = vsubps_avx(auVar151,auVar182);
        fVar194 = auVar268._0_4_;
        auVar183._0_4_ = fVar194 * auVar155._0_4_;
        fVar195 = auVar268._4_4_;
        auVar183._4_4_ = fVar195 * auVar155._4_4_;
        fVar240 = auVar268._8_4_;
        auVar183._8_4_ = fVar240 * auVar155._8_4_;
        fVar300 = auVar268._12_4_;
        auVar183._12_4_ = fVar300 * auVar155._12_4_;
        fVar221 = auVar106._0_4_;
        auVar120._0_4_ = fVar221 * auVar155._0_4_;
        fVar173 = auVar106._4_4_;
        auVar120._4_4_ = fVar173 * auVar155._4_4_;
        fVar192 = auVar106._8_4_;
        auVar120._8_4_ = fVar192 * auVar155._8_4_;
        fVar193 = auVar106._12_4_;
        auVar120._12_4_ = fVar193 * auVar155._12_4_;
        auVar295._0_4_ = fVar194 * auVar124._0_4_;
        auVar295._4_4_ = fVar195 * auVar124._4_4_;
        auVar295._8_4_ = fVar240 * auVar124._8_4_;
        auVar295._12_4_ = fVar300 * auVar124._12_4_;
        auVar152._0_4_ = fVar221 * auVar124._0_4_;
        auVar152._4_4_ = fVar173 * auVar124._4_4_;
        auVar152._8_4_ = fVar192 * auVar124._8_4_;
        auVar152._12_4_ = fVar193 * auVar124._12_4_;
        auVar155 = vminps_avx(auVar183,auVar295);
        auVar124 = vminps_avx(auVar120,auVar152);
        auVar268 = vminps_avx(auVar155,auVar124);
        auVar155 = vmaxps_avx(auVar295,auVar183);
        auVar124 = vmaxps_avx(auVar152,auVar120);
        auVar106 = vshufps_avx(auVar166,auVar166,0x54);
        auVar124 = vmaxps_avx(auVar124,auVar155);
        auVar107 = vshufps_avx(auVar305,auVar305,0);
        auVar135 = vshufps_avx(auVar305,auVar305,0x55);
        auVar155 = vhaddps_avx(auVar268,auVar268);
        auVar124 = vhaddps_avx(auVar124,auVar124);
        auVar167._0_4_ = auVar107._0_4_ * auVar83._0_4_ + auVar135._0_4_ * auVar292._0_4_;
        auVar167._4_4_ = auVar107._4_4_ * auVar83._4_4_ + auVar135._4_4_ * auVar292._4_4_;
        auVar167._8_4_ = auVar107._8_4_ * auVar83._8_4_ + auVar135._8_4_ * auVar292._8_4_;
        auVar167._12_4_ = auVar107._12_4_ * auVar83._12_4_ + auVar135._12_4_ * auVar292._12_4_;
        auVar268 = vsubps_avx(auVar106,auVar167);
        fVar219 = auVar268._0_4_ + auVar155._0_4_;
        fVar220 = auVar268._0_4_ + auVar124._0_4_;
        auVar155 = vmaxss_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar219));
        auVar124 = vminss_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar216));
      } while (auVar124._0_4_ < auVar155._0_4_);
      auVar155 = vmovshdup_avx(auVar83);
      auVar89._0_4_ = auVar155._0_4_ * auVar112._0_4_;
      auVar89._4_4_ = auVar155._4_4_ * auVar112._4_4_;
      auVar89._8_4_ = auVar155._8_4_ * auVar112._8_4_;
      auVar89._12_4_ = auVar155._12_4_ * auVar112._12_4_;
      auVar121._0_4_ = auVar141._0_4_ * auVar155._0_4_;
      auVar121._4_4_ = auVar141._4_4_ * auVar155._4_4_;
      auVar121._8_4_ = auVar141._8_4_ * auVar155._8_4_;
      auVar121._12_4_ = auVar141._12_4_ * auVar155._12_4_;
      auVar124 = vminps_avx(auVar89,auVar121);
      auVar155 = vmaxps_avx(auVar121,auVar89);
      auVar112 = vmovshdup_avx(auVar292);
      auVar184._0_4_ = auVar113._0_4_ * auVar112._0_4_;
      auVar184._4_4_ = auVar113._4_4_ * auVar112._4_4_;
      auVar184._8_4_ = auVar113._8_4_ * auVar112._8_4_;
      auVar184._12_4_ = auVar113._12_4_ * auVar112._12_4_;
      auVar122._0_4_ = auVar238._0_4_ * auVar112._0_4_;
      auVar122._4_4_ = auVar238._4_4_ * auVar112._4_4_;
      auVar122._8_4_ = auVar238._8_4_ * auVar112._8_4_;
      auVar122._12_4_ = auVar238._12_4_ * auVar112._12_4_;
      auVar112 = vminps_avx(auVar184,auVar122);
      auVar153._0_4_ = auVar124._0_4_ + auVar112._0_4_;
      auVar153._4_4_ = auVar124._4_4_ + auVar112._4_4_;
      auVar153._8_4_ = auVar124._8_4_ + auVar112._8_4_;
      auVar153._12_4_ = auVar124._12_4_ + auVar112._12_4_;
      auVar124 = vmaxps_avx(auVar122,auVar184);
      auVar90._0_4_ = auVar155._0_4_ + auVar124._0_4_;
      auVar90._4_4_ = auVar155._4_4_ + auVar124._4_4_;
      auVar90._8_4_ = auVar155._8_4_ + auVar124._8_4_;
      auVar90._12_4_ = auVar155._12_4_ + auVar124._12_4_;
      auVar155 = vsubps_avx(auVar230,auVar90);
      auVar124 = vsubps_avx(auVar230,auVar153);
      auVar154._0_4_ = fVar194 * auVar155._0_4_;
      auVar154._4_4_ = fVar195 * auVar155._4_4_;
      auVar154._8_4_ = fVar240 * auVar155._8_4_;
      auVar154._12_4_ = fVar300 * auVar155._12_4_;
      auVar185._0_4_ = fVar194 * auVar124._0_4_;
      auVar185._4_4_ = fVar195 * auVar124._4_4_;
      auVar185._8_4_ = fVar240 * auVar124._8_4_;
      auVar185._12_4_ = fVar300 * auVar124._12_4_;
      auVar91._0_4_ = fVar221 * auVar155._0_4_;
      auVar91._4_4_ = fVar173 * auVar155._4_4_;
      auVar91._8_4_ = fVar192 * auVar155._8_4_;
      auVar91._12_4_ = fVar193 * auVar155._12_4_;
      auVar123._0_4_ = fVar221 * auVar124._0_4_;
      auVar123._4_4_ = fVar173 * auVar124._4_4_;
      auVar123._8_4_ = fVar192 * auVar124._8_4_;
      auVar123._12_4_ = fVar193 * auVar124._12_4_;
      auVar155 = vminps_avx(auVar154,auVar185);
      auVar124 = vminps_avx(auVar91,auVar123);
      auVar155 = vminps_avx(auVar155,auVar124);
      auVar124 = vmaxps_avx(auVar185,auVar154);
      auVar112 = vmaxps_avx(auVar123,auVar91);
      auVar155 = vhaddps_avx(auVar155,auVar155);
      auVar124 = vmaxps_avx(auVar112,auVar124);
      auVar124 = vhaddps_avx(auVar124,auVar124);
      auVar112 = vmovshdup_avx(auVar268);
      auVar141 = ZEXT416((uint)(auVar112._0_4_ + auVar155._0_4_));
      auVar155 = vmaxss_avx(auVar339,auVar141);
      auVar112 = ZEXT416((uint)(auVar112._0_4_ + auVar124._0_4_));
      auVar124 = vminss_avx(auVar112,auVar77);
    } while (auVar124._0_4_ < auVar155._0_4_);
    uVar70 = 0;
    if ((fVar218 < fVar219) && (fVar220 < fVar216)) {
      auVar155 = vcmpps_avx(auVar112,auVar77,1);
      auVar124 = vcmpps_avx(auVar339,auVar141,1);
      auVar155 = vandps_avx(auVar124,auVar155);
      uVar70 = auVar155._0_4_;
    }
    auVar261._8_4_ = 0x7fffffff;
    auVar261._0_8_ = 0x7fffffff7fffffff;
    auVar261._12_4_ = 0x7fffffff;
    if ((3 < (uint)uVar75 || fVar217 < 0.001) || (uVar70 & 1) != 0) {
      lVar71 = 0xc9;
      do {
        lVar71 = lVar71 + -1;
        if (lVar71 == 0) goto LAB_0099caf2;
        fVar217 = auVar268._0_4_;
        fVar216 = 1.0 - fVar217;
        auVar155 = ZEXT416((uint)(fVar216 * fVar216 * fVar216));
        auVar155 = vshufps_avx(auVar155,auVar155,0);
        auVar124 = ZEXT416((uint)(fVar217 * 3.0 * fVar216 * fVar216));
        auVar124 = vshufps_avx(auVar124,auVar124,0);
        auVar112 = ZEXT416((uint)(fVar216 * fVar217 * fVar217 * 3.0));
        auVar112 = vshufps_avx(auVar112,auVar112,0);
        auVar141 = ZEXT416((uint)(fVar217 * fVar217 * fVar217));
        auVar141 = vshufps_avx(auVar141,auVar141,0);
        fVar216 = (float)local_6d0._0_4_ * auVar155._0_4_ +
                  local_5b0 * auVar124._0_4_ +
                  (float)local_3a0._0_4_ * auVar141._0_4_ + local_5c0 * auVar112._0_4_;
        fVar217 = (float)local_6d0._4_4_ * auVar155._4_4_ +
                  fStack_5ac * auVar124._4_4_ +
                  (float)local_3a0._4_4_ * auVar141._4_4_ + fStack_5bc * auVar112._4_4_;
        auVar92._0_8_ = CONCAT44(fVar217,fVar216);
        auVar92._8_4_ =
             fStack_6c8 * auVar155._8_4_ +
             fStack_5a8 * auVar124._8_4_ + fStack_398 * auVar141._8_4_ + fStack_5b8 * auVar112._8_4_
        ;
        auVar92._12_4_ =
             fStack_6c4 * auVar155._12_4_ +
             fStack_5a4 * auVar124._12_4_ +
             fStack_394 * auVar141._12_4_ + fStack_5b4 * auVar112._12_4_;
        auVar125._8_8_ = auVar92._0_8_;
        auVar125._0_8_ = auVar92._0_8_;
        auVar124 = vshufpd_avx(auVar92,auVar92,1);
        auVar155 = vmovshdup_avx(auVar268);
        auVar124 = vsubps_avx(auVar124,auVar125);
        auVar93._0_4_ = auVar155._0_4_ * auVar124._0_4_ + fVar216;
        auVar93._4_4_ = auVar155._4_4_ * auVar124._4_4_ + fVar217;
        auVar93._8_4_ = auVar155._8_4_ * auVar124._8_4_ + fVar216;
        auVar93._12_4_ = auVar155._12_4_ * auVar124._12_4_ + fVar217;
        auVar155 = vshufps_avx(auVar93,auVar93,0);
        auVar124 = vshufps_avx(auVar93,auVar93,0x55);
        auVar126._0_4_ = auVar83._0_4_ * auVar155._0_4_ + auVar292._0_4_ * auVar124._0_4_;
        auVar126._4_4_ = auVar83._4_4_ * auVar155._4_4_ + auVar292._4_4_ * auVar124._4_4_;
        auVar126._8_4_ = auVar83._8_4_ * auVar155._8_4_ + auVar292._8_4_ * auVar124._8_4_;
        auVar126._12_4_ = auVar83._12_4_ * auVar155._12_4_ + auVar292._12_4_ * auVar124._12_4_;
        auVar268 = vsubps_avx(auVar268,auVar126);
        auVar155 = vandps_avx(auVar261,auVar93);
        auVar124 = vshufps_avx(auVar155,auVar155,0xf5);
        auVar155 = vmaxss_avx(auVar124,auVar155);
      } while ((float)local_3b0._0_4_ <= auVar155._0_4_);
      fVar216 = auVar268._0_4_;
      if ((0.0 <= fVar216) && (fVar216 <= 1.0)) {
        auVar83 = vmovshdup_avx(auVar268);
        fVar217 = auVar83._0_4_;
        if ((0.0 <= fVar217) && (fVar217 <= 1.0)) {
          auVar83 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar238 = vinsertps_avx(auVar83,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28)
          ;
          auVar83 = vdpps_avx(auVar238,local_3c0,0x7f);
          auVar292 = vdpps_avx(auVar238,local_3d0,0x7f);
          auVar155 = vdpps_avx(auVar238,local_3e0,0x7f);
          auVar124 = vdpps_avx(auVar238,local_3f0,0x7f);
          auVar112 = vdpps_avx(auVar238,local_400,0x7f);
          auVar141 = vdpps_avx(auVar238,local_410,0x7f);
          auVar113 = vdpps_avx(auVar238,local_420,0x7f);
          auVar238 = vdpps_avx(auVar238,local_430,0x7f);
          fVar173 = 1.0 - fVar217;
          fVar192 = 1.0 - fVar216;
          fVar218 = auVar268._4_4_;
          fVar219 = auVar268._8_4_;
          fVar220 = auVar268._12_4_;
          fVar221 = fVar192 * fVar216 * fVar216 * 3.0;
          auVar248._0_4_ = fVar216 * fVar216 * fVar216;
          auVar248._4_4_ = fVar218 * fVar218 * fVar218;
          auVar248._8_4_ = fVar219 * fVar219 * fVar219;
          auVar248._12_4_ = fVar220 * fVar220 * fVar220;
          fVar219 = fVar192 * fVar192 * fVar216 * 3.0;
          fVar220 = fVar192 * fVar192 * fVar192;
          fVar218 = fVar220 * (fVar173 * auVar83._0_4_ + fVar217 * auVar112._0_4_) +
                    (fVar173 * auVar292._0_4_ + auVar141._0_4_ * fVar217) * fVar219 +
                    fVar221 * (auVar113._0_4_ * fVar217 + fVar173 * auVar155._0_4_) +
                    auVar248._0_4_ * (fVar173 * auVar124._0_4_ + fVar217 * auVar238._0_4_);
          if (((fVar198 <= fVar218) &&
              (fVar173 = *(float *)(ray + k * 4 + 0x100), fVar218 <= fVar173)) &&
             (pGVar14 = (context->scene->geometries).items[uVar69].ptr,
             (pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
            auStack_f0 = vshufps_avx(auVar268,auVar268,0x55);
            auVar271._8_4_ = 0x3f800000;
            auVar271._0_8_ = 0x3f8000003f800000;
            auVar271._12_4_ = 0x3f800000;
            auVar83 = vsubps_avx(auVar271,auStack_f0);
            fVar193 = auStack_f0._0_4_;
            fVar194 = auStack_f0._4_4_;
            fVar195 = auStack_f0._8_4_;
            fVar240 = auStack_f0._12_4_;
            fVar300 = auVar83._0_4_;
            fVar301 = auVar83._4_4_;
            fVar302 = auVar83._8_4_;
            fVar303 = auVar83._12_4_;
            auVar286._0_4_ = fVar193 * (float)local_4c0._0_4_ + fVar300 * (float)local_4b0._0_4_;
            auVar286._4_4_ = fVar194 * (float)local_4c0._4_4_ + fVar301 * (float)local_4b0._4_4_;
            auVar286._8_4_ = fVar195 * fStack_4b8 + fVar302 * fStack_4a8;
            auVar286._12_4_ = fVar240 * fStack_4b4 + fVar303 * fStack_4a4;
            auVar296._0_4_ = fVar193 * (float)local_500._0_4_ + fVar300 * (float)local_4e0._0_4_;
            auVar296._4_4_ = fVar194 * (float)local_500._4_4_ + fVar301 * (float)local_4e0._4_4_;
            auVar296._8_4_ = fVar195 * fStack_4f8 + fVar302 * fStack_4d8;
            auVar296._12_4_ = fVar240 * fStack_4f4 + fVar303 * fStack_4d4;
            auVar306._0_4_ = fVar193 * (float)local_450._0_4_ + fVar300 * (float)local_4f0._0_4_;
            auVar306._4_4_ = fVar194 * (float)local_450._4_4_ + fVar301 * (float)local_4f0._4_4_;
            auVar306._8_4_ = fVar195 * fStack_448 + fVar302 * fStack_4e8;
            auVar306._12_4_ = fVar240 * fStack_444 + fVar303 * fStack_4e4;
            auVar272._0_4_ = fVar193 * fVar196 + fVar300 * (float)local_4d0._0_4_;
            auVar272._4_4_ = fVar194 * fVar197 + fVar301 * (float)local_4d0._4_4_;
            auVar272._8_4_ = fVar195 * fVar222 + fVar302 * fStack_4c8;
            auVar272._12_4_ = fVar240 * fVar234 + fVar303 * fStack_4c4;
            auVar124 = vsubps_avx(auVar296,auVar286);
            auVar112 = vsubps_avx(auVar306,auVar296);
            auVar141 = vsubps_avx(auVar272,auVar306);
            auStack_110 = vshufps_avx(auVar268,auVar268,0);
            fVar240 = auStack_110._0_4_;
            fVar300 = auStack_110._4_4_;
            fVar301 = auStack_110._8_4_;
            fVar302 = auStack_110._12_4_;
            auVar83 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
            fVar192 = auVar83._0_4_;
            fVar193 = auVar83._4_4_;
            fVar194 = auVar83._8_4_;
            fVar195 = auVar83._12_4_;
            auVar83 = vshufps_avx(auVar248,auVar248,0);
            auVar292 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
            auVar155 = vshufps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),0);
            auVar231._0_4_ =
                 (fVar192 * (fVar192 * auVar124._0_4_ + fVar240 * auVar112._0_4_) +
                 fVar240 * (fVar192 * auVar112._0_4_ + fVar240 * auVar141._0_4_)) * 3.0;
            auVar231._4_4_ =
                 (fVar193 * (fVar193 * auVar124._4_4_ + fVar300 * auVar112._4_4_) +
                 fVar300 * (fVar193 * auVar112._4_4_ + fVar300 * auVar141._4_4_)) * 3.0;
            auVar231._8_4_ =
                 (fVar194 * (fVar194 * auVar124._8_4_ + fVar301 * auVar112._8_4_) +
                 fVar301 * (fVar194 * auVar112._8_4_ + fVar301 * auVar141._8_4_)) * 3.0;
            auVar231._12_4_ =
                 (fVar195 * (fVar195 * auVar124._12_4_ + fVar302 * auVar112._12_4_) +
                 fVar302 * (fVar195 * auVar112._12_4_ + fVar302 * auVar141._12_4_)) * 3.0;
            auVar124 = vshufps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),0);
            auVar186._0_4_ =
                 auVar124._0_4_ * (float)local_460._0_4_ +
                 auVar155._0_4_ * (float)local_470._0_4_ +
                 auVar83._0_4_ * (float)local_490._0_4_ + auVar292._0_4_ * (float)local_480._0_4_;
            auVar186._4_4_ =
                 auVar124._4_4_ * (float)local_460._4_4_ +
                 auVar155._4_4_ * (float)local_470._4_4_ +
                 auVar83._4_4_ * (float)local_490._4_4_ + auVar292._4_4_ * (float)local_480._4_4_;
            auVar186._8_4_ =
                 auVar124._8_4_ * fStack_458 +
                 auVar155._8_4_ * fStack_468 +
                 auVar83._8_4_ * fStack_488 + auVar292._8_4_ * fStack_478;
            auVar186._12_4_ =
                 auVar124._12_4_ * fStack_454 +
                 auVar155._12_4_ * fStack_464 +
                 auVar83._12_4_ * fStack_484 + auVar292._12_4_ * fStack_474;
            auVar83 = vshufps_avx(auVar231,auVar231,0xc9);
            auVar210._0_4_ = auVar186._0_4_ * auVar83._0_4_;
            auVar210._4_4_ = auVar186._4_4_ * auVar83._4_4_;
            auVar210._8_4_ = auVar186._8_4_ * auVar83._8_4_;
            auVar210._12_4_ = auVar186._12_4_ * auVar83._12_4_;
            auVar83 = vshufps_avx(auVar186,auVar186,0xc9);
            auVar187._0_4_ = auVar231._0_4_ * auVar83._0_4_;
            auVar187._4_4_ = auVar231._4_4_ * auVar83._4_4_;
            auVar187._8_4_ = auVar231._8_4_ * auVar83._8_4_;
            auVar187._12_4_ = auVar231._12_4_ * auVar83._12_4_;
            auVar83 = vsubps_avx(auVar187,auVar210);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              auStack_170 = vshufps_avx(auVar83,auVar83,0x55);
              auStack_150 = vshufps_avx(auVar83,auVar83,0xaa);
              auStack_130 = vshufps_avx(auVar83,auVar83,0);
              local_180[0] = (RTCHitN)auStack_170[0];
              local_180[1] = (RTCHitN)auStack_170[1];
              local_180[2] = (RTCHitN)auStack_170[2];
              local_180[3] = (RTCHitN)auStack_170[3];
              local_180[4] = (RTCHitN)auStack_170[4];
              local_180[5] = (RTCHitN)auStack_170[5];
              local_180[6] = (RTCHitN)auStack_170[6];
              local_180[7] = (RTCHitN)auStack_170[7];
              local_180[8] = (RTCHitN)auStack_170[8];
              local_180[9] = (RTCHitN)auStack_170[9];
              local_180[10] = (RTCHitN)auStack_170[10];
              local_180[0xb] = (RTCHitN)auStack_170[0xb];
              local_180[0xc] = (RTCHitN)auStack_170[0xc];
              local_180[0xd] = (RTCHitN)auStack_170[0xd];
              local_180[0xe] = (RTCHitN)auStack_170[0xe];
              local_180[0xf] = (RTCHitN)auStack_170[0xf];
              local_160 = auStack_150;
              local_140 = auStack_130;
              local_120 = auStack_110;
              local_100 = auStack_f0;
              local_e0 = local_340._0_8_;
              uStack_d8 = local_340._8_8_;
              uStack_d0 = local_340._16_8_;
              uStack_c8 = local_340._24_8_;
              local_c0 = local_320;
              vcmpps_avx(local_320,local_320,0xf);
              uStack_9c = context->user->instID[0];
              local_a0 = uStack_9c;
              uStack_98 = uStack_9c;
              uStack_94 = uStack_9c;
              uStack_90 = uStack_9c;
              uStack_8c = uStack_9c;
              uStack_88 = uStack_9c;
              uStack_84 = uStack_9c;
              uStack_7c = context->user->instPrimID[0];
              local_80 = uStack_7c;
              uStack_78 = uStack_7c;
              uStack_74 = uStack_7c;
              uStack_70 = uStack_7c;
              uStack_6c = uStack_7c;
              uStack_68 = uStack_7c;
              uStack_64 = uStack_7c;
              *(float *)(ray + k * 4 + 0x100) = fVar218;
              local_580 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar74 & 0xf) << 4));
              local_570 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar74 >> 4) * 0x10)
              ;
              local_550.valid = (int *)local_580;
              local_550.geometryUserPtr = pGVar14->userPtr;
              local_550.context = context->user;
              local_550.hit = local_180;
              local_550.N = 8;
              local_550.ray = (RTCRayN *)ray;
              if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar14->intersectionFilterN)(&local_550);
              }
              auVar83 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
              auVar292 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
              auVar160._16_16_ = auVar292;
              auVar160._0_16_ = auVar83;
              auVar94 = _DAT_01f7b020 & ~auVar160;
              if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar94 >> 0x7f,0) != '\0') ||
                    (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar94 >> 0xbf,0) != '\0') ||
                  (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar94[0x1f] < '\0') {
                p_Var15 = context->args->filter;
                if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var15)(&local_550);
                }
                auVar83 = vpcmpeqd_avx(local_580,ZEXT816(0) << 0x40);
                auVar292 = vpcmpeqd_avx(local_570,ZEXT816(0) << 0x40);
                auVar103._16_16_ = auVar292;
                auVar103._0_16_ = auVar83;
                auVar94 = _DAT_01f7b020 & ~auVar103;
                if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar94 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar94 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar94 >> 0x7f,0) != '\0') ||
                      (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar94 >> 0xbf,0) != '\0') ||
                    (auVar94 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar94[0x1f] < '\0') {
                  auVar104._0_8_ = auVar83._0_8_ ^ 0xffffffffffffffff;
                  auVar104._8_4_ = auVar83._8_4_ ^ 0xffffffff;
                  auVar104._12_4_ = auVar83._12_4_ ^ 0xffffffff;
                  auVar104._16_4_ = auVar292._0_4_ ^ 0xffffffff;
                  auVar104._20_4_ = auVar292._4_4_ ^ 0xffffffff;
                  auVar104._24_4_ = auVar292._8_4_ ^ 0xffffffff;
                  auVar104._28_4_ = auVar292._12_4_ ^ 0xffffffff;
                  auVar94 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])local_550.hit);
                  *(undefined1 (*) [32])(local_550.ray + 0x180) = auVar94;
                  auVar94 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])(local_550.hit + 0x20));
                  *(undefined1 (*) [32])(local_550.ray + 0x1a0) = auVar94;
                  auVar94 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])(local_550.hit + 0x40));
                  *(undefined1 (*) [32])(local_550.ray + 0x1c0) = auVar94;
                  auVar94 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])(local_550.hit + 0x60));
                  *(undefined1 (*) [32])(local_550.ray + 0x1e0) = auVar94;
                  auVar94 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])(local_550.hit + 0x80));
                  *(undefined1 (*) [32])(local_550.ray + 0x200) = auVar94;
                  auVar94 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])(local_550.hit + 0xa0));
                  *(undefined1 (*) [32])(local_550.ray + 0x220) = auVar94;
                  auVar94 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])(local_550.hit + 0xc0));
                  *(undefined1 (*) [32])(local_550.ray + 0x240) = auVar94;
                  auVar94 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])(local_550.hit + 0xe0));
                  *(undefined1 (*) [32])(local_550.ray + 0x260) = auVar94;
                  auVar94 = vmaskmovps_avx(auVar104,*(undefined1 (*) [32])(local_550.hit + 0x100));
                  *(undefined1 (*) [32])(local_550.ray + 0x280) = auVar94;
                  goto LAB_0099caf2;
                }
              }
              *(float *)(ray + k * 4 + 0x100) = fVar173;
              goto LAB_0099caf2;
            }
            *(float *)(ray + k * 4 + 0x100) = fVar218;
            uVar6 = vextractps_avx(auVar83,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar6;
            uVar6 = vextractps_avx(auVar83,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar6;
            *(int *)(ray + k * 4 + 0x1c0) = auVar83._0_4_;
            *(float *)(ray + k * 4 + 0x1e0) = fVar216;
            *(float *)(ray + k * 4 + 0x200) = fVar217;
            *(uint *)(ray + k * 4 + 0x220) = uVar13;
            *(uint *)(ray + k * 4 + 0x240) = uVar69;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          }
        }
      }
      goto LAB_0099caf2;
    }
    auVar83 = vinsertps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar216),0x10);
    auVar340 = ZEXT1664(auVar83);
    auVar333 = ZEXT1664(auVar339);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }